

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void duckdb_je_dallocx(void *ptr,int flags)

{
  arena_t *paVar1;
  ulong uVar2;
  uintptr_t uVar3;
  undefined8 uVar4;
  tsd_t *ptVar5;
  cache_bin_sz_t cVar6;
  uint uVar7;
  tcache_t *ptVar8;
  te_ctx_t *ctx_00;
  uint in_ESI;
  rtree_leaf_elm_t *in_RDI;
  long *in_FS_OFFSET;
  bool bVar9;
  rtree_metadata_t rVar10;
  uintptr_t args_raw [3];
  tcache_t *tcache;
  uint tcache_ind;
  _Bool fast;
  tsd_t *tsd;
  _Bool fast_1;
  tcache_t *tcache_1;
  size_t usize_1;
  emap_alloc_ctx_t alloc_ctx_5;
  size_t usize;
  emap_alloc_ctx_t alloc_ctx;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_metadata_t metadata_5;
  rtree_ctx_t *rtree_ctx_9;
  rtree_ctx_t rtree_ctx_fallback_9;
  size_t ret_9;
  size_t ret;
  tsd_t *tsd_2;
  uint8_t state_6;
  uint arena_ind;
  edata_t *edata;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  void *result;
  tsd_t *tsd_3;
  uint8_t state_12;
  uint arena_ind_1;
  edata_t *edata_2;
  rtree_ctx_t *rtree_ctx_5;
  rtree_ctx_t rtree_ctx_fallback_5;
  void *result_1;
  tsd_t *tsd_4;
  uint8_t state_28;
  uint arena_ind_2;
  edata_t *edata_4;
  rtree_ctx_t *rtree_ctx_10;
  rtree_ctx_t rtree_ctx_fallback_10;
  void *result_2;
  tsd_t *tsd_5;
  uint8_t state_34;
  uint arena_ind_3;
  edata_t *edata_6;
  rtree_ctx_t *rtree_ctx_14;
  rtree_ctx_t rtree_ctx_fallback_14;
  void *result_3;
  emap_alloc_ctx_t alloc_ctx_9;
  rtree_metadata_t metadata_9;
  rtree_ctx_t *rtree_ctx_16;
  rtree_ctx_t rtree_ctx_fallback_16;
  emap_alloc_ctx_t alloc_ctx_7;
  rtree_metadata_t metadata_7;
  rtree_ctx_t *rtree_ctx_12;
  rtree_ctx_t rtree_ctx_fallback_12;
  emap_alloc_ctx_t alloc_ctx_4;
  rtree_metadata_t metadata_4;
  rtree_ctx_t *rtree_ctx_7;
  rtree_ctx_t rtree_ctx_fallback_7;
  emap_alloc_ctx_t alloc_ctx_2;
  rtree_metadata_t metadata_2;
  rtree_ctx_t *rtree_ctx_3;
  rtree_ctx_t rtree_ctx_fallback_3;
  _Bool ret_3;
  uint remain;
  cache_bin_sz_t max;
  cache_bin_t *bin;
  cache_bin_sz_t ncached_max;
  uint nbins;
  _Bool disabled;
  size_t ret_2;
  _Bool ret_7;
  uint remain_2;
  cache_bin_sz_t max_1;
  cache_bin_t *bin_2;
  cache_bin_sz_t ncached_max_2;
  uint nbins_2;
  _Bool disabled_2;
  size_t ret_6;
  _Bool ret_12;
  uint remain_4;
  cache_bin_sz_t max_2;
  cache_bin_t *bin_4;
  cache_bin_sz_t ncached_max_4;
  uint nbins_4;
  _Bool disabled_4;
  size_t ret_11;
  _Bool ret_16;
  uint remain_6;
  cache_bin_sz_t max_3;
  cache_bin_t *bin_6;
  cache_bin_sz_t ncached_max_6;
  uint nbins_6;
  _Bool disabled_6;
  size_t ret_15;
  edata_t *edata_1;
  _Bool is_sample_promoted;
  rtree_ctx_t *rtree_ctx_4;
  rtree_ctx_t rtree_ctx_fallback_4;
  cache_bin_sz_t ncached_max_1;
  uint nbins_1;
  _Bool disabled_1;
  edata_t *edata_3;
  _Bool is_sample_promoted_1;
  rtree_ctx_t *rtree_ctx_8;
  rtree_ctx_t rtree_ctx_fallback_8;
  cache_bin_sz_t ncached_max_3;
  uint nbins_3;
  _Bool disabled_3;
  edata_t *edata_5;
  _Bool is_sample_promoted_2;
  rtree_ctx_t *rtree_ctx_13;
  rtree_ctx_t rtree_ctx_fallback_13;
  cache_bin_sz_t ncached_max_5;
  uint nbins_5;
  _Bool disabled_5;
  edata_t *edata_7;
  _Bool is_sample_promoted_3;
  rtree_ctx_t *rtree_ctx_17;
  rtree_ctx_t rtree_ctx_fallback_17;
  cache_bin_sz_t ncached_max_7;
  uint nbins_7;
  _Bool disabled_7;
  uint16_t diff_3;
  uint16_t low_bits_head_3;
  uint16_t diff_2;
  uint16_t low_bits_head_2;
  uint16_t diff_1;
  uint16_t low_bits_head_1;
  uint16_t diff;
  uint16_t low_bits_head;
  _Bool ret_17;
  uint remain_7;
  cache_bin_t *bin_7;
  _Bool ret_13;
  uint remain_5;
  cache_bin_t *bin_5;
  _Bool ret_8;
  uint remain_3;
  cache_bin_t *bin_3;
  _Bool ret_4;
  uint remain_1;
  cache_bin_t *bin_1;
  uint8_t state;
  tsd_t *tsd_1;
  uint8_t state_3;
  tcaches_t *elm;
  uint8_t state_2;
  uint8_t state_39;
  uint8_t state_33;
  uint8_t state_17;
  uint8_t state_11;
  uint8_t state_10;
  uint8_t state_16;
  uint8_t state_32;
  uint8_t state_38;
  uint8_t state_35;
  uint8_t state_29;
  uint8_t state_13;
  uint8_t state_7;
  uint8_t state_27;
  uint8_t state_5;
  uint64_t bytes_before_1;
  te_ctx_t ctx_1;
  uint64_t bytes_before;
  te_ctx_t ctx;
  uint8_t state_18;
  uint8_t state_22;
  uint8_t state_40;
  uint8_t state_44;
  uint8_t state_41;
  uint8_t state_19;
  uint8_t state_42;
  uint8_t state_20;
  uint8_t state_43;
  uint8_t state_21;
  uint8_t state_45;
  uint8_t state_23;
  uint8_t state_46;
  uint8_t state_24;
  uint8_t state_47;
  uint8_t state_25;
  emap_alloc_ctx_t alloc_ctx_8;
  rtree_metadata_t metadata_8;
  rtree_ctx_t *rtree_ctx_15;
  rtree_ctx_t rtree_ctx_fallback_15;
  size_t ret_14;
  uint8_t state_36;
  emap_alloc_ctx_t alloc_ctx_6;
  rtree_metadata_t metadata_6;
  rtree_ctx_t *rtree_ctx_11;
  rtree_ctx_t rtree_ctx_fallback_11;
  size_t ret_10;
  uint8_t state_30;
  emap_alloc_ctx_t alloc_ctx_3;
  rtree_metadata_t metadata_3;
  rtree_ctx_t *rtree_ctx_6;
  rtree_ctx_t rtree_ctx_fallback_6;
  size_t ret_5;
  uint8_t state_14;
  emap_alloc_ctx_t alloc_ctx_1;
  rtree_metadata_t metadata_1;
  rtree_ctx_t *rtree_ctx_2;
  rtree_ctx_t rtree_ctx_fallback_2;
  size_t ret_1;
  uint8_t state_8;
  uint8_t state_37;
  uint8_t state_31;
  uint8_t state_15;
  uint8_t state_9;
  uint8_t state_1;
  uint8_t state_26;
  uint8_t state_4;
  undefined4 in_stack_ffffffffffffc5f8;
  undefined4 in_stack_ffffffffffffc5fc;
  uint uVar11;
  atomic_p_t in_stack_ffffffffffffc600;
  undefined4 in_stack_ffffffffffffc608;
  undefined4 in_stack_ffffffffffffc60c;
  tsd_t *in_stack_ffffffffffffc610;
  undefined4 in_stack_ffffffffffffc620;
  undefined4 in_stack_ffffffffffffc624;
  arena_t *in_stack_ffffffffffffc628;
  undefined4 in_stack_ffffffffffffc630;
  undefined4 in_stack_ffffffffffffc634;
  tsdn_t *in_stack_ffffffffffffc638;
  uintptr_t in_stack_ffffffffffffc640;
  rtree_ctx_t *in_stack_ffffffffffffc648;
  rtree_ctx_t *rtree_ctx_18;
  rtree_t *in_stack_ffffffffffffc650;
  rtree_t *rtree;
  undefined4 in_stack_ffffffffffffc658;
  hook_dalloc_t in_stack_ffffffffffffc65c;
  te_ctx_t *in_stack_ffffffffffffc6b0;
  tsd_t *in_stack_ffffffffffffc6b8;
  tsd_t *in_stack_ffffffffffffc6c0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_38e0;
  uint local_38bc [2];
  byte local_38b1;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_38b0;
  rtree_leaf_elm_t *local_38a8;
  tsd_t *local_38a0;
  tsd_t *local_3898;
  tsd_t *local_3890;
  tsd_t *local_3888;
  tsd_t *local_3880;
  tsd_t *local_3878;
  size_t local_3870;
  uint local_3864 [2];
  byte local_3859;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_3858;
  rtree_leaf_elm_t *local_3850;
  tsd_t *local_3848;
  tsd_t *local_3840;
  tsd_t *local_3838;
  tsd_t *local_3830;
  tsd_t *local_3828;
  tsd_t *local_3820;
  uint local_3814;
  rtree_metadata_t local_3810;
  uintptr_t local_37fc;
  undefined4 local_37f4;
  rtree_ctx_t *local_37f0;
  rtree_ctx_t local_37e8;
  ulong *local_3668;
  emap_t *local_3658;
  tsd_t *local_3650;
  rtree_metadata_t local_3648;
  undefined8 local_3634;
  undefined4 local_362c;
  rtree_ctx_t *local_3628;
  rtree_ctx_t local_3620;
  ulong *local_34a0;
  emap_t *local_3490;
  tsd_t *local_3488;
  uint local_3480;
  uint local_347c;
  ulong local_3478;
  tsd_t *local_3470;
  ulong local_3468;
  tsd_t *local_3460;
  tsd_t *local_3458;
  tsd_t *local_3448;
  tsd_t *local_3440;
  tsd_t *local_3438;
  tsd_t *local_3430;
  tsd_t *local_3428;
  ulong local_3420;
  uint local_3414;
  size_t local_3410;
  uint local_3408;
  uint local_3404;
  uint local_3400;
  byte local_33fa;
  byte local_33f9;
  ulong *local_33f8;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_33f0;
  rtree_leaf_elm_t *local_33e8;
  tsd_t *local_33e0;
  rtree_leaf_elm_t *prStack_33d8;
  tsd_t *ptStack_33d0;
  tsd_t *local_33c8;
  tsd_t *local_33c0;
  tsd_t *local_33b8;
  tsd_t *local_33b0;
  tsd_t *local_33a8;
  witness_tsd_t *local_33a0;
  uint8_t local_3391;
  tsd_t *local_3390;
  tsd_t *local_3388;
  tsd_t *local_3380;
  rtree_leaf_elm_t *local_3378;
  tsd_t *local_3370;
  uint local_3364;
  edata_t *local_3360;
  rtree_leaf_elm_t *local_3358;
  tsd_t *local_3350;
  edata_t *local_3348;
  rtree_ctx_t *local_3330;
  rtree_ctx_t local_3328;
  rtree_leaf_elm_t *local_31a8;
  emap_t *local_31a0;
  tsd_t *local_3198;
  arena_t *paStack_3190;
  undefined4 local_3184;
  atomic_p_t *local_3180;
  undefined4 local_3174;
  undefined4 uStack_3170;
  byte local_316a;
  byte local_3169;
  ulong *local_3168;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_3160;
  rtree_leaf_elm_t *local_3158;
  tsd_t *local_3150;
  rtree_leaf_elm_t *prStack_3148;
  tsd_t *ptStack_3140;
  tsd_t *local_3138;
  tsd_t *local_3130;
  tsd_t *local_3128;
  tsd_t *local_3120;
  tsd_t *local_3118;
  witness_tsd_t *local_3110;
  uint8_t local_3101;
  tsd_t *local_3100;
  tsd_t *local_30f8;
  tsd_t *local_30f0;
  rtree_leaf_elm_t *local_30e8;
  tsd_t *local_30e0;
  uint local_30d4;
  edata_t *local_30d0;
  rtree_leaf_elm_t *local_30c8;
  tsd_t *local_30c0;
  edata_t *local_30b8;
  rtree_ctx_t *local_30a0;
  rtree_ctx_t local_3098;
  rtree_leaf_elm_t *local_2f18;
  emap_t *local_2f10;
  tsd_t *local_2f08;
  arena_t *paStack_2f00;
  undefined4 local_2ef4;
  atomic_p_t *local_2ef0;
  undefined4 local_2ee4;
  undefined4 uStack_2ee0;
  byte local_2eda;
  byte local_2ed9;
  ulong *local_2ed8;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_2ed0;
  rtree_leaf_elm_t *local_2ec8;
  tsd_t *local_2ec0;
  rtree_leaf_elm_t *prStack_2eb8;
  tsd_t *ptStack_2eb0;
  tsd_t *local_2ea8;
  tsd_t *local_2ea0;
  tsd_t *local_2e98;
  tsd_t *local_2e90;
  tsd_t *local_2e88;
  witness_tsd_t *local_2e80;
  uint8_t local_2e71;
  tsd_t *local_2e70;
  tsd_t *local_2e68;
  tsd_t *local_2e60;
  rtree_leaf_elm_t *local_2e58;
  tsd_t *local_2e50;
  uint local_2e44;
  edata_t *local_2e40;
  rtree_leaf_elm_t *local_2e38;
  tsd_t *local_2e30;
  edata_t *local_2e28;
  rtree_ctx_t *local_2e10;
  rtree_ctx_t local_2e08;
  rtree_leaf_elm_t *local_2c88;
  emap_t *local_2c80;
  tsd_t *local_2c78;
  arena_t *paStack_2c70;
  undefined4 local_2c64;
  tsdn_t *local_2c60;
  undefined4 local_2c54;
  undefined4 uStack_2c50;
  byte local_2c4a;
  byte local_2c49;
  ulong *local_2c48;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_2c40;
  rtree_leaf_elm_t *local_2c38;
  tsd_t *local_2c30;
  rtree_leaf_elm_t *prStack_2c28;
  tsd_t *ptStack_2c20;
  tsd_t *local_2c18;
  tsd_t *local_2c10;
  tsd_t *local_2c08;
  tsd_t *local_2c00;
  tsd_t *local_2bf8;
  witness_tsd_t *local_2bf0;
  uint8_t local_2be1;
  tsd_t *local_2be0;
  tsd_t *local_2bd8;
  tsd_t *local_2bd0;
  rtree_leaf_elm_t *local_2bc8;
  tsd_t *local_2bc0;
  uint local_2bb4;
  edata_t *local_2bb0;
  rtree_leaf_elm_t *local_2ba8;
  tsd_t *local_2ba0;
  edata_t *local_2b98;
  rtree_ctx_t *local_2b80;
  rtree_ctx_t local_2b78;
  rtree_leaf_elm_t *local_29f8;
  emap_t *local_29f0;
  tsd_t *local_29e8;
  void *pvStack_29e0;
  undefined4 local_29d4;
  tsd_t *local_29d0;
  undefined4 local_29c4;
  undefined4 uStack_29c0;
  ulong local_29bc;
  byte local_29b1;
  ulong *local_29b0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_29a8;
  rtree_leaf_elm_t *local_29a0;
  tsd_t *local_2998;
  rtree_metadata_t local_2990;
  undefined8 local_297c;
  undefined4 local_2974;
  rtree_ctx_t *local_2970;
  rtree_ctx_t local_2968;
  ulong *local_27e8;
  rtree_leaf_elm_t *local_27e0;
  emap_t *local_27d8;
  tsd_t *local_27d0;
  tsd_t *local_27c8;
  ulong local_27bc;
  byte local_27b1;
  ulong *local_27b0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_27a8;
  rtree_leaf_elm_t *local_27a0;
  tsd_t *local_2798;
  rtree_metadata_t local_2790;
  undefined8 local_277c;
  undefined4 local_2774;
  rtree_ctx_t *local_2770;
  rtree_ctx_t local_2768;
  ulong *local_25e8;
  rtree_leaf_elm_t *local_25e0;
  emap_t *local_25d8;
  tsd_t *local_25d0;
  tsd_t *local_25c8;
  ulong local_25bc;
  byte local_25b1;
  ulong *local_25b0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_25a8;
  rtree_leaf_elm_t *local_25a0;
  tsd_t *local_2598;
  rtree_metadata_t local_2590;
  undefined8 local_257c;
  undefined4 local_2574;
  rtree_ctx_t *local_2570;
  rtree_ctx_t local_2568;
  ulong *local_23e8;
  rtree_leaf_elm_t *local_23e0;
  emap_t *local_23d8;
  tsd_t *local_23d0;
  tsd_t *local_23c8;
  ulong local_23bc;
  byte local_23b1;
  ulong *local_23b0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_23a8;
  rtree_leaf_elm_t *local_23a0;
  tsd_t *local_2398;
  rtree_metadata_t local_2390;
  undefined8 local_237c;
  undefined4 local_2374;
  rtree_ctx_t *local_2370;
  rtree_ctx_t local_2368;
  ulong *local_21e8;
  rtree_leaf_elm_t *local_21e0;
  emap_t *local_21d8;
  tsd_t *local_21d0;
  tsd_t *local_21c8;
  rtree_leaf_elm_t *local_21c0;
  tsd_t *local_21b8;
  rtree_leaf_elm_t *local_21b0;
  tsd_t *local_21a8;
  rtree_leaf_elm_t *local_21a0;
  tsd_t *local_2198;
  rtree_leaf_elm_t *local_2190;
  tsd_t *local_2188;
  undefined1 local_2179;
  uint local_2178;
  cache_bin_sz_t local_2172;
  cache_bin_t *local_2170;
  byte local_2165;
  uint local_2164;
  rtree_leaf_elm_t *local_2160;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_2158;
  tsd_t *local_2150;
  tsd_t *local_2148;
  cache_bin_sz_t local_213a;
  uint local_2138;
  byte local_2131;
  tcache_slow_t *local_2130;
  cache_bin_t *local_2128;
  uint local_211c;
  undefined1 local_2101;
  uint local_2100;
  cache_bin_sz_t local_20fa;
  cache_bin_t *local_20f8;
  byte local_20ed;
  uint local_20ec;
  rtree_leaf_elm_t *local_20e8;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_20e0;
  tsd_t *local_20d8;
  tsd_t *local_20d0;
  cache_bin_sz_t local_20c2;
  uint local_20c0;
  byte local_20b9;
  tcache_slow_t *local_20b8;
  cache_bin_t *local_20b0;
  uint local_20a4;
  undefined1 local_2089;
  uint local_2088;
  cache_bin_sz_t local_2082;
  cache_bin_t *local_2080;
  byte local_2075;
  uint local_2074;
  rtree_leaf_elm_t *local_2070;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_2068;
  tsd_t *local_2060;
  tsd_t *local_2058;
  cache_bin_sz_t local_204a;
  uint local_2048;
  byte local_2041;
  tcache_slow_t *local_2040;
  cache_bin_t *local_2038;
  uint local_202c;
  undefined1 local_2011;
  uint local_2010;
  cache_bin_sz_t local_200a;
  cache_bin_t *local_2008;
  byte local_1ffd;
  uint local_1ffc;
  rtree_leaf_elm_t *local_1ff8;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1ff0;
  tsd_t *local_1fe8;
  tsd_t *local_1fe0;
  cache_bin_sz_t local_1fd2;
  uint local_1fd0;
  byte local_1fc9;
  tcache_slow_t *local_1fc8;
  cache_bin_t *local_1fc0;
  uint local_1fb4;
  undefined8 local_1fa0;
  undefined1 local_1f96;
  byte local_1f95;
  uint local_1f94;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1f90;
  rtree_leaf_elm_t *local_1f88;
  tsd_t *local_1f80;
  undefined8 local_1f78;
  rtree_ctx_t *local_1f60;
  rtree_ctx_t local_1f58;
  rtree_leaf_elm_t *local_1dd8;
  emap_t *local_1dd0;
  tsd_t *local_1dc8;
  cache_bin_sz_t local_1dba;
  uint local_1db8;
  byte local_1db1;
  tcache_slow_t *local_1db0;
  cache_bin_t *local_1da8;
  uint local_1d9c;
  tsd_t *local_1d98;
  undefined8 local_1d90;
  undefined1 local_1d86;
  byte local_1d85;
  uint local_1d84;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1d80;
  rtree_leaf_elm_t *local_1d78;
  tsd_t *local_1d70;
  undefined8 local_1d68;
  rtree_ctx_t *local_1d50;
  rtree_ctx_t local_1d48;
  rtree_leaf_elm_t *local_1bc8;
  emap_t *local_1bc0;
  tsd_t *local_1bb8;
  cache_bin_sz_t local_1baa;
  uint local_1ba8;
  byte local_1ba1;
  tcache_slow_t *local_1ba0;
  cache_bin_t *local_1b98;
  uint local_1b8c;
  tsd_t *local_1b88;
  undefined8 local_1b80;
  undefined1 local_1b76;
  byte local_1b75;
  uint local_1b74;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1b70;
  rtree_leaf_elm_t *local_1b68;
  tsd_t *local_1b60;
  undefined8 local_1b58;
  rtree_ctx_t *local_1b40;
  rtree_ctx_t local_1b38;
  rtree_leaf_elm_t *local_19b8;
  emap_t *local_19b0;
  tsd_t *local_19a8;
  cache_bin_sz_t local_199a;
  uint local_1998;
  byte local_1991;
  tcache_slow_t *local_1990;
  cache_bin_t *local_1988;
  uint local_197c;
  tsd_t *local_1978;
  undefined8 local_1970;
  undefined1 local_1966;
  byte local_1965;
  uint local_1964;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1960;
  rtree_leaf_elm_t *local_1958;
  tsd_t *local_1950;
  undefined8 local_1948;
  rtree_ctx_t *local_1930;
  rtree_ctx_t local_1928;
  rtree_leaf_elm_t *local_17a8;
  emap_t *local_17a0;
  tsd_t *local_1798;
  cache_bin_sz_t local_178a;
  uint local_1788;
  byte local_1781;
  tcache_slow_t *local_1780;
  cache_bin_t *local_1778;
  uint local_176c;
  tsd_t *local_1768;
  uint local_175c;
  rtree_leaf_elm_t *local_1758;
  undefined8 local_1750;
  uint local_1744;
  rtree_leaf_elm_t *local_1740;
  undefined8 local_1738;
  uint local_172c;
  rtree_leaf_elm_t *local_1728;
  undefined8 local_1720;
  uint local_1714;
  rtree_leaf_elm_t *local_1710;
  undefined8 local_1708;
  rtree_leaf_elm_t *local_1700;
  rtree_leaf_elm_t *local_16f8;
  rtree_leaf_elm_t *local_16f0;
  rtree_leaf_elm_t *local_16e8;
  rtree_leaf_elm_t *local_1678;
  cache_bin_t *local_1670;
  undefined1 local_1661;
  rtree_leaf_elm_t *local_1660;
  cache_bin_t *local_1658;
  undefined1 local_1649;
  rtree_leaf_elm_t *local_1648;
  cache_bin_t *local_1640;
  undefined1 local_1631;
  rtree_leaf_elm_t *local_1630;
  cache_bin_t *local_1628;
  undefined1 local_1619;
  rtree_leaf_elm_t *local_1618;
  cache_bin_t *local_1610;
  undefined1 local_1601;
  rtree_leaf_elm_t *local_1600;
  cache_bin_t *local_15f8;
  undefined1 local_15e9;
  rtree_leaf_elm_t *local_15e8;
  cache_bin_t *local_15e0;
  undefined1 local_15d1;
  rtree_leaf_elm_t *local_15d0;
  cache_bin_t *local_15c8;
  undefined1 local_15b9;
  cache_bin_t *local_15b8;
  cache_bin_t *local_15b0;
  cache_bin_t *local_15a8;
  cache_bin_t *local_15a0;
  cache_bin_t *local_1598;
  cache_bin_t *local_1590;
  cache_bin_t *local_1588;
  cache_bin_t *local_1580;
  rtree_leaf_elm_t *local_1558;
  cache_bin_t *local_1550;
  rtree_leaf_elm_t *local_1548;
  cache_bin_t *local_1540;
  rtree_leaf_elm_t *local_1538;
  cache_bin_t *local_1530;
  rtree_leaf_elm_t *local_1528;
  cache_bin_t *local_1520;
  rtree_leaf_elm_t *local_1518;
  cache_bin_t *local_1510;
  rtree_leaf_elm_t *local_1508;
  cache_bin_t *local_1500;
  rtree_leaf_elm_t *local_14f8;
  cache_bin_t *local_14f0;
  rtree_leaf_elm_t *local_14e8;
  cache_bin_t *local_14e0;
  undefined1 local_14d5;
  uint local_14d4;
  cache_bin_t *local_14d0;
  byte local_14c5;
  uint local_14c4;
  rtree_leaf_elm_t *local_14c0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_14b8;
  tsd_t *local_14b0;
  rtree_leaf_elm_t *local_14a8;
  cache_bin_t *local_14a0;
  undefined1 local_1491;
  rtree_leaf_elm_t *local_1490;
  cache_bin_t *local_1488;
  undefined1 local_1479;
  cache_bin_t *local_1478;
  cache_bin_t *local_1470;
  rtree_leaf_elm_t *local_1468;
  cache_bin_t *local_1460;
  rtree_leaf_elm_t *local_1458;
  cache_bin_t *local_1450;
  undefined1 local_1445;
  uint local_1444;
  cache_bin_t *local_1440;
  byte local_1435;
  uint local_1434;
  rtree_leaf_elm_t *local_1430;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1428;
  tsd_t *local_1420;
  rtree_leaf_elm_t *local_1418;
  cache_bin_t *local_1410;
  undefined1 local_1401;
  rtree_leaf_elm_t *local_1400;
  cache_bin_t *local_13f8;
  undefined1 local_13e9;
  cache_bin_t *local_13e8;
  cache_bin_t *local_13e0;
  rtree_leaf_elm_t *local_13d8;
  cache_bin_t *local_13d0;
  rtree_leaf_elm_t *local_13c8;
  cache_bin_t *local_13c0;
  undefined1 local_13b5;
  uint local_13b4;
  cache_bin_t *local_13b0;
  byte local_13a5;
  uint local_13a4;
  rtree_leaf_elm_t *local_13a0;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1398;
  tsd_t *local_1390;
  rtree_leaf_elm_t *local_1388;
  cache_bin_t *local_1380;
  undefined1 local_1371;
  rtree_leaf_elm_t *local_1370;
  cache_bin_t *local_1368;
  undefined1 local_1359;
  cache_bin_t *local_1358;
  cache_bin_t *local_1350;
  rtree_leaf_elm_t *local_1348;
  cache_bin_t *local_1340;
  rtree_leaf_elm_t *local_1338;
  cache_bin_t *local_1330;
  undefined1 local_1325;
  uint local_1324;
  cache_bin_t *local_1320;
  byte local_1315;
  uint local_1314;
  rtree_leaf_elm_t *local_1310;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_1308;
  tsd_t *local_1300;
  rtree_leaf_elm_t *local_12f8;
  cache_bin_t *local_12f0;
  undefined1 local_12e1;
  rtree_leaf_elm_t *local_12e0;
  cache_bin_t *local_12d8;
  undefined1 local_12c9;
  cache_bin_t *local_12c8;
  cache_bin_t *local_12c0;
  rtree_leaf_elm_t *local_12b8;
  cache_bin_t *local_12b0;
  rtree_leaf_elm_t *local_12a8;
  cache_bin_t *local_12a0;
  tsd_t *local_1298;
  tsd_t *local_1290;
  tsd_t *local_1288;
  tsd_t *local_1280;
  tsd_t *local_1278;
  uint8_t local_1269;
  tsd_t *local_1268;
  tsd_t *local_1260;
  tsd_t *local_1258;
  tsd_t *local_1250;
  undefined1 local_1242;
  undefined1 local_1241;
  tsd_t *local_1240;
  tsd_t *local_1238;
  tsd_t *local_1230;
  undefined1 local_1221;
  tsd_t *local_1220;
  tcache_t *local_1218;
  uint8_t local_1209;
  tsd_t *local_1208;
  tsd_t *local_1200;
  tsd_t *local_11f8;
  anon_union_8_2_150e8edc_for_tcaches_s_0 *local_11f0;
  uint local_11e4;
  tsd_t *local_11e0;
  tsd_t *local_11d8;
  undefined1 local_11c9;
  tsd_t *local_11c8;
  uint8_t local_11b9;
  tsd_t *local_11b8;
  tsd_t *local_11b0;
  tsd_t *local_11a8;
  rtree_ctx_t *local_11a0;
  tsd_t *local_1198;
  rtree_ctx_t *local_1190;
  tsd_t *local_1188;
  tsd_t *local_1180;
  rtree_ctx_t *local_1178;
  tsd_t *local_1170;
  rtree_ctx_t *local_1168;
  tsd_t *local_1160;
  tsd_t *local_1158;
  rtree_ctx_t *local_1150;
  tsd_t *local_1148;
  rtree_ctx_t *local_1140;
  tsd_t *local_1138;
  tsd_t *local_1130;
  rtree_ctx_t *local_1128;
  tsd_t *local_1120;
  rtree_ctx_t *local_1118;
  tsd_t *local_1110;
  tsd_t *local_1108;
  rtree_ctx_t *local_1100;
  tsd_t *local_10f8;
  rtree_ctx_t *local_10f0;
  tsd_t *local_10e8;
  tsd_t *local_10e0;
  rtree_ctx_t *local_10d8;
  tsd_t *local_10d0;
  rtree_ctx_t *local_10c8;
  tsd_t *local_10c0;
  tsd_t *local_10b8;
  rtree_ctx_t *local_10b0;
  tsd_t *local_10a8;
  rtree_ctx_t *local_10a0;
  tsd_t *local_1098;
  tsd_t *local_1090;
  rtree_ctx_t *local_1088;
  tsd_t *local_1080;
  rtree_ctx_t *local_1078;
  tsd_t *local_1070;
  tsd_t *local_1068;
  rtree_ctx_t *local_1060;
  tsd_t *local_1058;
  rtree_ctx_t *local_1050;
  tsd_t *local_1048;
  tsd_t *local_1040;
  rtree_ctx_t *local_1038;
  tsd_t *local_1030;
  rtree_ctx_t *local_1028;
  tsd_t *local_1020;
  tsd_t *local_1018;
  rtree_ctx_t *local_1010;
  tsd_t *local_1008;
  rtree_ctx_t *local_1000;
  tsd_t *local_ff8;
  tsd_t *local_ff0;
  rtree_ctx_t *local_fe8;
  tsd_t *local_fe0;
  rtree_ctx_t *local_fd8;
  tsd_t *local_fd0;
  tsd_t *local_fc8;
  rtree_ctx_t *local_fc0;
  tsd_t *local_fb8;
  rtree_ctx_t *local_fb0;
  tsd_t *local_fa8;
  tsd_t *local_fa0;
  rtree_ctx_t *local_f98;
  tsd_t *local_f90;
  rtree_ctx_t *local_f88;
  tsd_t *local_f80;
  tsd_t *local_f78;
  tsd_t *local_f70;
  tsd_t *local_f68;
  tsd_t *local_f60;
  tsd_t *local_f58;
  tsd_t *local_f50;
  tsd_t *local_f48;
  tsd_t *local_f40;
  tsd_t *local_f38;
  tsd_t *local_f30;
  tsd_t *local_f28;
  tsd_t *local_f20;
  tsd_t *local_f18;
  tsd_t *local_f10;
  tsd_t *local_f08;
  uint8_t local_ef9;
  tsd_t *local_ef8;
  tsd_t *local_ef0;
  tsd_t *local_ee8;
  uint8_t local_ed9;
  tsd_t *local_ed8;
  tsd_t *local_ed0;
  tsd_t *local_ec8;
  uint8_t local_eb9;
  tsd_t *local_eb8;
  tsd_t *local_eb0;
  tsd_t *local_ea8;
  uint8_t local_e99;
  tsd_t *local_e98;
  tsd_t *local_e90;
  tsd_t *local_e88;
  uint8_t local_e79;
  tsd_t *local_e78;
  tsd_t *local_e70;
  tsd_t *local_e68;
  uint8_t local_e59;
  tsd_t *local_e58;
  tsd_t *local_e50;
  tsd_t *local_e48;
  uint8_t local_e39;
  tsd_t *local_e38;
  tsd_t *local_e30;
  tsd_t *local_e28;
  uint8_t local_e19;
  tsd_t *local_e18;
  tsd_t *local_e10;
  tsd_t *local_e08;
  uint8_t local_df9;
  tsd_t *local_df8;
  tsd_t *local_df0;
  tsd_t *local_de8;
  uint8_t local_dd9;
  tsd_t *local_dd8;
  tsd_t *local_dd0;
  tsd_t *local_dc8;
  uint8_t local_db9;
  tsd_t *local_db8;
  tsd_t *local_db0;
  tsd_t *local_da8;
  uint8_t local_d99;
  tsd_t *local_d98;
  tsd_t *local_d90;
  tsd_t *local_d88;
  uint8_t local_d79;
  tsd_t *local_d78;
  tsd_t *local_d70;
  tsd_t *local_d68;
  uint8_t local_d59;
  tsd_t *local_d58;
  tsd_t *local_d50;
  tsd_t *local_d48;
  uint64_t local_d40;
  undefined1 local_d38 [16];
  uint64_t *local_d28;
  uint64_t *local_d18;
  undefined1 local_d09;
  ulong local_d08;
  tsd_t *local_d00;
  uint64_t local_cf8;
  undefined1 local_cf0 [16];
  uint64_t *local_ce0;
  uint64_t *local_cd0;
  undefined1 local_cc1;
  ulong local_cc0;
  tsd_t *local_cb8;
  tsd_t *local_ca8;
  tsd_t *local_c98;
  undefined1 local_c89;
  undefined1 *local_c88;
  tsd_t *local_c80;
  uint8_t local_c51;
  tsd_t *local_c50;
  tsd_t *local_c48;
  tsd_t *local_c40;
  undefined1 local_c31;
  undefined1 *local_c30;
  tsd_t *local_c28;
  uint8_t local_bf9;
  tsd_t *local_bf8;
  tsd_t *local_bf0;
  tsd_t *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  uint64_t local_bd0;
  undefined1 *local_bc8;
  uint64_t local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  uint8_t local_af9;
  tsd_t *local_af8;
  tsd_t *local_af0;
  uint8_t local_ae1;
  tsd_t *local_ae0;
  tsd_t *local_ad8;
  uint8_t local_ac9;
  tsd_t *local_ac8;
  tsd_t *local_ac0;
  uint8_t local_ab1;
  tsd_t *local_ab0;
  tsd_t *local_aa8;
  uint8_t local_a99;
  tsd_t *local_a98;
  tsd_t *local_a90;
  tsd_t *local_a88;
  uint8_t local_a79;
  tsd_t *local_a78;
  tsd_t *local_a70;
  tsd_t *local_a68;
  tsd_t *local_a40;
  tsd_t *local_a38;
  tsd_t *local_a30;
  tsd_t *local_a28;
  uint auStack_a20 [2];
  rtree_leaf_elm_t *prStack_a18;
  tsd_t *ptStack_a10;
  rtree_metadata_t rStack_a08;
  undefined8 uStack_9f4;
  undefined4 uStack_9ec;
  rtree_ctx_t *prStack_9e8;
  rtree_ctx_t rStack_9e0;
  uint *puStack_860;
  rtree_leaf_elm_t *prStack_858;
  emap_t *peStack_850;
  tsd_t *ptStack_848;
  uint uStack_83c;
  size_t sStack_838;
  uint uStack_830;
  uint uStack_82c;
  rtree_ctx_t *prStack_828;
  tsd_t *ptStack_820;
  rtree_ctx_t *prStack_818;
  tsd_t *ptStack_810;
  tsd_t *ptStack_808;
  tsd_t *ptStack_800;
  uint8_t uStack_7f1;
  tsd_t *ptStack_7f0;
  tsd_t *ptStack_7e8;
  tsd_t *ptStack_7e0;
  uint auStack_7d8 [2];
  rtree_leaf_elm_t *prStack_7d0;
  tsd_t *ptStack_7c8;
  rtree_metadata_t rStack_7c0;
  undefined8 uStack_7ac;
  undefined4 uStack_7a4;
  rtree_ctx_t *prStack_7a0;
  rtree_ctx_t rStack_798;
  uint *puStack_618;
  rtree_leaf_elm_t *prStack_610;
  emap_t *peStack_608;
  tsd_t *ptStack_600;
  uint uStack_5f4;
  size_t sStack_5f0;
  uint uStack_5e8;
  uint uStack_5e4;
  rtree_ctx_t *prStack_5e0;
  tsd_t *ptStack_5d8;
  rtree_ctx_t *prStack_5d0;
  tsd_t *ptStack_5c8;
  tsd_t *ptStack_5c0;
  tsd_t *ptStack_5b8;
  uint8_t uStack_5a9;
  tsd_t *ptStack_5a8;
  tsd_t *ptStack_5a0;
  tsd_t *ptStack_598;
  uint auStack_590 [2];
  rtree_leaf_elm_t *prStack_588;
  tsd_t *ptStack_580;
  rtree_metadata_t rStack_578;
  undefined8 uStack_564;
  undefined4 uStack_55c;
  rtree_ctx_t *prStack_558;
  rtree_ctx_t rStack_550;
  uint *puStack_3d0;
  rtree_leaf_elm_t *prStack_3c8;
  emap_t *peStack_3c0;
  tsd_t *ptStack_3b8;
  uint uStack_3ac;
  size_t sStack_3a8;
  uint uStack_3a0;
  uint uStack_39c;
  rtree_ctx_t *prStack_398;
  tsd_t *ptStack_390;
  rtree_ctx_t *prStack_388;
  tsd_t *ptStack_380;
  tsd_t *ptStack_378;
  tsd_t *ptStack_370;
  uint8_t uStack_361;
  tsd_t *ptStack_360;
  tsd_t *ptStack_358;
  tsd_t *ptStack_350;
  uint auStack_348 [2];
  rtree_leaf_elm_t *prStack_340;
  tsd_t *ptStack_338;
  rtree_metadata_t rStack_330;
  undefined8 uStack_31c;
  undefined4 uStack_314;
  rtree_ctx_t *prStack_310;
  rtree_ctx_t rStack_308;
  uint *puStack_188;
  rtree_leaf_elm_t *prStack_180;
  emap_t *peStack_178;
  tsd_t *ptStack_170;
  uint uStack_164;
  size_t sStack_160;
  uint uStack_158;
  uint uStack_154;
  rtree_ctx_t *prStack_150;
  tsd_t *ptStack_148;
  rtree_ctx_t *prStack_140;
  tsd_t *ptStack_138;
  tsd_t *ptStack_130;
  tsd_t *ptStack_128;
  uint8_t uStack_119;
  tsd_t *ptStack_118;
  tsd_t *ptStack_110;
  tsd_t *ptStack_108;
  tsd_t *local_100;
  tsd_t *local_f8;
  tsd_t *local_f0;
  tsd_t *local_e8;
  uint8_t local_d9;
  tsd_t *local_d8;
  tsd_t *local_d0;
  uint8_t local_c1;
  tsd_t *local_c0;
  tsd_t *local_b8;
  uint8_t local_a9;
  tsd_t *local_a8;
  tsd_t *local_a0;
  uint8_t local_91;
  tsd_t *local_90;
  tsd_t *local_88;
  uint8_t local_79;
  tsd_t *local_78;
  tsd_t *local_70;
  uint8_t local_61;
  tsd_t *local_60;
  tsd_t *local_58;
  uint8_t local_49;
  tsd_t *local_48;
  tsd_t *local_40;
  tsd_t *local_38;
  tsd_t *local_30;
  tsd_t *local_28;
  tsd_t *local_20;
  tsd_t *local_18;
  tsd_t *local_10;
  tsd_t *local_8;
  
  local_1241 = 1;
  local_1242 = 1;
  local_1221 = 1;
  local_1250 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_1240 = local_1250;
  ptVar5 = local_1250;
  local_1230 = local_1250;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_1240 = duckdb_je_tsd_fetch_slow
                           (in_stack_ffffffffffffc610,
                            SUB41((uint)in_stack_ffffffffffffc60c >> 0x18,0));
    ptVar5 = local_1238;
  }
  local_1238 = ptVar5;
  ptVar5 = local_1240;
  local_1278 = local_1240;
  bVar9 = (local_1240->state).repr == '\0';
  if (bVar9) {
    local_3448 = local_1240;
  }
  if ((in_ESI & 0xfff00) == 0) {
    local_3814 = 0xfffffffe;
  }
  else if ((in_ESI & 0xfff00) == 0x100) {
    local_3814 = 0xffffffff;
  }
  else {
    local_3814 = ((in_ESI & 0xfff00) >> 8) - 2;
  }
  if (local_3814 == 0xfffffffe) {
    if (bVar9) {
      local_1268 = local_1240;
      local_1260 = local_1240;
      local_1269 = (local_1240->state).repr;
      local_1258 = local_1240;
      local_38e0.tcache = &local_1240->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
    else {
      local_79 = (local_1240->state).repr;
      if (local_1240->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0'
         ) {
        local_1220 = local_1240;
        local_11d8 = local_1240;
        local_11c8 = local_1240;
        local_11b8 = local_1240;
        local_11b0 = local_1240;
        local_11b9 = (local_1240->state).repr;
        local_11a8 = local_1240;
        local_11c9 = (local_1240->
                      cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled & 1U) !=
                     0;
        if ((bool)local_11c9) {
          local_1208 = local_1240;
          local_1200 = local_1240;
          local_1209 = (local_1240->state).repr;
          local_11f8 = local_1240;
          local_1218 = &local_1240->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
        else {
          local_1218 = (tcache_t *)0x0;
        }
        local_38e0.tcache = local_1218;
      }
      else {
        local_38e0.tcache = (tcache_t *)0x0;
      }
      local_3428 = local_1240;
      local_78 = local_3428;
      local_70 = local_3428;
      local_28 = local_3428;
    }
  }
  else if (local_3814 == 0xffffffff) {
    local_38e0.tcache = (tcache_t *)0x0;
  }
  else {
    local_11e0 = local_1240;
    local_11e4 = local_3814;
    local_11f0 = &duckdb_je_tcaches[local_3814].field_0;
    if (local_11f0->tcache == (tcache_t *)0x0) {
      duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n",(ulong)local_3814);
      abort();
    }
    if (local_11f0->tcache == (tcache_t *)0x1) {
      ptVar8 = duckdb_je_tcache_create_explicit(in_stack_ffffffffffffc6c0);
      local_11f0->tcache = ptVar8;
    }
    local_38e0.tcache = *(tcache_t **)local_11f0;
  }
  if (!bVar9) {
    ctx_00 = (te_ctx_t *)(long)(int)in_ESI;
    rtree = (rtree_t *)&stack0xffffffffffffc6b8;
    rtree_ctx_18 = (rtree_ctx_t *)&stack0xffffffffffffc6c0;
    do {
      rtree->base = 0;
      rtree = (rtree_t *)((long)rtree + 8);
    } while (rtree != (rtree_t *)rtree_ctx_18);
    duckdb_je_hook_invoke_dalloc(in_stack_ffffffffffffc65c,rtree,(uintptr_t *)rtree_ctx_18);
    local_38a0 = ptVar5;
    local_38b0.tcache = local_38e0.tcache;
    local_38b1 = 1;
    local_3880 = ptVar5;
    local_3878 = ptVar5;
    local_3430 = ptVar5;
    local_60 = ptVar5;
    local_58 = ptVar5;
    local_61 = (ptVar5->state).repr;
    local_30 = ptVar5;
    local_3888 = ptVar5;
    local_3488 = ptVar5;
    local_3490 = &duckdb_je_arena_emap_global;
    local_34a0 = (ulong *)local_38bc;
    local_fb8 = ptVar5;
    local_fc0 = &local_3620;
    local_fa8 = ptVar5;
    local_38a8 = in_RDI;
    if (ptVar5 == (tsd_t *)0x0) {
      duckdb_je_rtree_ctx_data_init(local_fc0);
      local_fb0 = local_fc0;
    }
    else {
      local_fa0 = ptVar5;
      local_f68 = ptVar5;
      local_d78 = ptVar5;
      local_d70 = ptVar5;
      local_d79 = (ptVar5->state).repr;
      local_d68 = ptVar5;
      local_fb0 = &ptVar5->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    local_3628 = local_fb0;
    rVar10 = rtree_metadata_read((tsdn_t *)
                                 CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),rtree
                                 ,rtree_ctx_18,in_stack_ffffffffffffc640);
    local_3648._0_8_ = rVar10._0_8_;
    local_3634._0_4_ = local_3648.szind;
    local_3634._4_4_ = local_3648.state;
    uVar4 = local_3634;
    local_3648._8_4_ = rVar10._8_4_;
    local_362c._0_1_ = local_3648.is_head;
    local_362c._1_1_ = local_3648.slab;
    local_362c._2_2_ = local_3648._10_2_;
    local_3634._0_4_ = rVar10.szind;
    local_3648 = rVar10;
    *(szind_t *)local_34a0 = (szind_t)local_3634;
    local_3634 = uVar4;
    *(byte *)((long)local_34a0 + 4) = local_362c._1_1_ & 1;
    local_347c = local_38bc[0];
    local_3414 = local_38bc[0];
    local_3400 = local_38bc[0];
    uVar2 = duckdb_je_sz_index2size_tab[local_38bc[0]];
    local_3420 = uVar2;
    if (((local_38b1 ^ 0xff) & 1) == 0) {
      if (((local_38b1 & 1) != 0) && ((duckdb_je_opt_junk_free & 1U) != 0)) {
        default_junk_free(in_stack_ffffffffffffc600.repr,
                          CONCAT44(in_stack_ffffffffffffc5fc,in_stack_ffffffffffffc5f8));
      }
      local_3898 = local_38a0;
      local_2c30 = local_38a0;
      local_2c38 = local_38a8;
      local_2c40.tcache = local_38b0.tcache;
      local_2c48 = (ulong *)local_38bc;
      local_2c49 = 0;
      local_2c4a = 1;
      local_2bf8 = local_38a0;
      local_2bd8 = local_38a0;
      if (local_38a0 == (tsd_t *)0x0) {
        local_2bf0 = (witness_tsd_t *)0x0;
      }
      else {
        local_2bd0 = local_38a0;
        local_2c00 = local_38a0;
        local_2be0 = local_38a0;
        local_1298 = local_38a0;
        local_2be1 = (local_38a0->state).repr;
        local_100 = local_38a0;
        local_2bf0 = &local_38a0->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
      }
      witness_assert_depth_to_rank((witness_tsdn_t *)local_2bf0,WITNESS_RANK_CORE,0);
      if ((local_2c49 & 1) != 0) {
        local_2bc0 = local_2c30;
        local_2bc8 = local_2c38;
        local_2ba0 = local_2c30;
        local_2ba8 = local_2c38;
        local_29e8 = local_2c30;
        local_29f0 = &duckdb_je_arena_emap_global;
        local_29f8 = local_2c38;
        local_1058 = local_2c30;
        local_1060 = &local_2b78;
        local_1048 = local_2c30;
        if (local_2c30 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_1060);
          local_1050 = local_1060;
        }
        else {
          local_1040 = local_2c30;
          local_f48 = local_2c30;
          local_df8 = local_2c30;
          local_df0 = local_2c30;
          local_df9 = (local_2c30->state).repr;
          local_de8 = local_2c30;
          local_1050 = &local_2c30->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_2b80 = local_1050;
        rtree_read(in_stack_ffffffffffffc638,
                   (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                   (rtree_ctx_t *)in_stack_ffffffffffffc628,
                   CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
        local_2bb0 = local_2b98;
        local_2bb4 = edata_arena_ind_get(local_2b98);
        in_stack_ffffffffffffc610 = (tsd_t *)(duckdb_je_arenas + local_2bb4);
        local_29d4 = 0;
        local_29c4 = 0;
        uStack_29c0 = 0;
        in_stack_ffffffffffffc60c = 0;
        in_stack_ffffffffffffc600.repr = *(void **)in_stack_ffffffffffffc610;
        ptStack_2c20 = local_2c30;
        prStack_2c28 = local_2c38;
        ptStack_a10 = local_2c30;
        prStack_a18 = local_2c38;
        ptStack_848 = local_2c30;
        peStack_850 = &duckdb_je_arena_emap_global;
        prStack_858 = local_2c38;
        puStack_860 = auStack_a20;
        ptStack_820 = local_2c30;
        prStack_828 = &rStack_9e0;
        ptStack_810 = local_2c30;
        pvStack_29e0 = in_stack_ffffffffffffc600.repr;
        local_29d0 = in_stack_ffffffffffffc610;
        if (local_2c30 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(prStack_828);
          prStack_818 = prStack_828;
        }
        else {
          ptStack_808 = local_2c30;
          ptStack_800 = local_2c30;
          ptStack_7f0 = local_2c30;
          ptStack_7e8 = local_2c30;
          uStack_7f1 = (local_2c30->state).repr;
          ptStack_7e0 = local_2c30;
          prStack_818 = &local_2c30->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        prStack_9e8 = prStack_818;
        rVar10 = rtree_metadata_read((tsdn_t *)
                                     CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                     rtree,rtree_ctx_18,in_stack_ffffffffffffc640);
        rStack_a08._0_8_ = rVar10._0_8_;
        uStack_9f4._0_4_ = rStack_a08.szind;
        uStack_9f4._4_4_ = rStack_a08.state;
        uVar4 = uStack_9f4;
        rStack_a08._8_4_ = rVar10._8_4_;
        uStack_9ec._0_1_ = rStack_a08.is_head;
        uStack_9ec._1_1_ = rStack_a08.slab;
        uStack_9ec._2_2_ = rStack_a08._10_2_;
        uStack_9f4._0_4_ = rVar10.szind;
        rStack_a08 = rVar10;
        *puStack_860 = (uint)uStack_9f4;
        uStack_9f4 = uVar4;
        *(byte *)(puStack_860 + 1) = uStack_9ec._1_1_ & 1;
        uStack_83c = auStack_a20[0];
        uStack_830 = auStack_a20[0];
        uStack_82c = auStack_a20[0];
        sStack_838 = duckdb_je_sz_index2size_tab[auStack_a20[0]];
        arena_internal_sub((arena_t *)in_stack_ffffffffffffc600.repr,sStack_838);
      }
      if (((local_2c49 & 1) == 0) && (local_2c10 = local_2c30, local_2c30 != (tsd_t *)0x0)) {
        local_2c08 = local_2c30;
        local_2c18 = local_2c30;
        local_d8 = local_2c30;
        local_d0 = local_2c30;
        local_d9 = (local_2c30->state).repr;
        local_8 = local_2c30;
      }
      local_2998 = local_2c30;
      local_29a0 = local_2c38;
      local_29a8.tcache = local_2c40.tcache;
      local_29b0 = local_2c48;
      local_29b1 = local_2c4a & 1;
      if (local_2c40.tcache == (tcache_t *)0x0) {
        arena_dalloc_no_tcache
                  ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                   in_stack_ffffffffffffc600.repr);
      }
      else {
        if (local_2c48 == (ulong *)0x0) {
          local_27d0 = local_2c30;
          local_27d8 = &duckdb_je_arena_emap_global;
          local_27e0 = local_2c38;
          local_27e8 = &local_29bc;
          local_1080 = local_2c30;
          local_1088 = &local_2968;
          local_1070 = local_2c30;
          if (local_2c30 == (tsd_t *)0x0) {
            duckdb_je_rtree_ctx_data_init(local_1088);
            local_1078 = local_1088;
          }
          else {
            local_1068 = local_2c30;
            local_f40 = local_2c30;
            local_e18 = local_2c30;
            local_e10 = local_2c30;
            local_e19 = (local_2c30->state).repr;
            local_e08 = local_2c30;
            local_1078 = &local_2c30->
                          cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
          }
          local_2970 = local_1078;
          rVar10 = rtree_metadata_read((tsdn_t *)
                                       CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658)
                                       ,rtree,rtree_ctx_18,in_stack_ffffffffffffc640);
          local_2990._0_8_ = rVar10._0_8_;
          local_297c._0_4_ = local_2990.szind;
          local_297c._4_4_ = local_2990.state;
          uVar4 = local_297c;
          local_2990._8_4_ = rVar10._8_4_;
          local_2974._0_1_ = local_2990.is_head;
          local_2974._1_1_ = local_2990.slab;
          local_2974._2_2_ = local_2990._10_2_;
          local_297c._0_4_ = rVar10.szind;
          local_2990 = rVar10;
          *(szind_t *)local_27e8 = (szind_t)local_297c;
          local_297c = uVar4;
          *(byte *)((long)local_27e8 + 4) = local_2974._1_1_ & 1;
        }
        else {
          local_29bc = *local_2c48;
        }
        if ((local_29bc & 0x100000000) == 0) {
          local_1950 = local_2998;
          local_1958 = local_29a0;
          local_1960.tcache = local_29a8.tcache;
          local_1964 = (uint)local_29bc;
          local_1965 = local_29b1 & 1;
          local_1966 = 0;
          uVar11 = (uint)local_29bc;
          uVar7 = tcache_nbins_get((local_29a8.tcache)->tcache_slow);
          if (uVar11 < uVar7) {
            local_1778 = (local_1960.tcache)->bins + local_1964;
            local_1780 = (local_1960.tcache)->tcache_slow;
            local_176c = local_1964;
            local_1781 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
            local_1788 = tcache_nbins_get(local_1780);
            local_178a = cache_bin_ncached_max_get_unsafe(local_1778);
            if ((local_1781 & 1) == 0) {
              local_1768 = local_1950;
              local_14b0 = local_1950;
              local_14b8.tcache = local_1960.tcache;
              local_14c0 = local_1958;
              local_14c4 = local_1964;
              local_14c5 = local_1965 & 1;
              local_14d0 = (local_1960.tcache)->bins + local_1964;
              local_1490 = local_1958;
              bVar9 = ((uint)local_14d0->stack_head & 0xffff) != (uint)local_14d0->low_bits_full;
              local_1488 = local_14d0;
              local_1479 = bVar9;
              local_1478 = local_14d0;
              if (bVar9) {
                local_1468 = local_1958;
                local_14d0->stack_head = local_14d0->stack_head + -1;
                *local_14d0->stack_head = local_1958;
                local_1460 = local_14d0;
                cache_bin_assert_earlier
                          (local_14d0,local_14d0->low_bits_full,(uint16_t)local_14d0->stack_head);
              }
              else {
                cVar6 = cache_bin_ncached_max_get((cache_bin_t *)0x249ff28);
                local_14d4 = (int)(uint)cVar6 >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f);
                duckdb_je_tcache_bin_flush_large
                          (local_14b0,local_14b8.tcache,local_14d0,local_14c4,local_14d4);
                local_14a0 = local_14d0;
                local_14a8 = local_14c0;
                local_1470 = local_14d0;
                local_14d5 = ((uint)local_14d0->stack_head & 0xffff) !=
                             (uint)local_14d0->low_bits_full;
                local_1491 = local_14d5;
                if ((bool)local_14d5) {
                  local_1450 = local_14d0;
                  local_1458 = local_14c0;
                  local_14d0->stack_head = local_14d0->stack_head + -1;
                  *local_14d0->stack_head = local_14c0;
                  cache_bin_assert_earlier
                            (local_14d0,local_14d0->low_bits_full,(uint16_t)local_14d0->stack_head);
                }
              }
              goto LAB_024a0202;
            }
          }
          local_1798 = local_1950;
          local_17a0 = &duckdb_je_arena_emap_global;
          local_17a8 = local_1958;
          local_1198 = local_1950;
          local_11a0 = &local_1928;
          local_1188 = local_1950;
          if (local_1950 == (tsd_t *)0x0) {
            duckdb_je_rtree_ctx_data_init(local_11a0);
            local_1190 = local_11a0;
          }
          else {
            local_1180 = local_1950;
            local_f08 = local_1950;
            local_ef8 = local_1950;
            local_ef0 = local_1950;
            local_ef9 = (local_1950->state).repr;
            local_ee8 = local_1950;
            local_1190 = &local_1950->
                          cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
          }
          local_1930 = local_1190;
          rtree_read(in_stack_ffffffffffffc638,
                     (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                     (rtree_ctx_t *)in_stack_ffffffffffffc628,
                     CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
          local_1970 = local_1948;
          local_1750 = local_1948;
          local_1758 = local_1958;
          local_175c = local_1964;
          duckdb_je_large_dalloc
                    ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                     (edata_t *)in_stack_ffffffffffffc600.repr);
        }
        else {
          local_2188 = local_2998;
          local_2190 = local_29a0;
          local_27c8 = local_2998;
          local_1fe8 = local_2998;
          local_1ff0.tcache = local_29a8.tcache;
          local_1ff8 = local_29a0;
          local_1ffc = (uint)local_29bc;
          local_1ffd = local_29b1 & 1;
          local_2008 = (local_29a8.tcache)->bins + (local_29bc & 0xffffffff);
          local_1700 = local_29a0;
          local_1660 = local_29a0;
          bVar9 = ((uint)local_2008->stack_head & 0xffff) != (uint)local_2008->low_bits_full;
          local_1658 = local_2008;
          local_1649 = bVar9;
          local_1588 = local_2008;
          if (bVar9) {
            local_14f8 = local_29a0;
            local_2008->stack_head = local_2008->stack_head + -1;
            *local_2008->stack_head = local_29a0;
            local_14f0 = local_2008;
            cache_bin_assert_earlier
                      (local_2008,local_2008->low_bits_full,(uint16_t)local_2008->stack_head);
          }
          else {
            local_1fc8 = (local_29a8.tcache)->tcache_slow;
            local_1fb4 = (uint)local_29bc;
            local_1fc0 = local_2008;
            local_1fc9 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
            local_1fd0 = tcache_nbins_get(local_1fc8);
            local_1fd2 = cache_bin_ncached_max_get_unsafe(local_1fc0);
            if ((local_1fc9 & 1) == 0) {
              local_200a = cache_bin_ncached_max_get((cache_bin_t *)0x249fae2);
              local_2010 = (int)(uint)local_200a >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f);
              duckdb_je_tcache_bin_flush_small
                        (local_1fe8,local_1ff0.tcache,local_2008,local_1ffc,local_2010);
              local_1670 = local_2008;
              local_1678 = local_1ff8;
              local_1580 = local_2008;
              local_2011 = ((uint)local_2008->stack_head & 0xffff) !=
                           (uint)local_2008->low_bits_full;
              local_1661 = local_2011;
              if ((bool)local_2011) {
                local_14e0 = local_2008;
                local_14e8 = local_1ff8;
                local_2008->stack_head = local_2008->stack_head + -1;
                *local_2008->stack_head = local_1ff8;
                cache_bin_assert_earlier
                          (local_2008,local_2008->low_bits_full,(uint16_t)local_2008->stack_head);
              }
            }
            else {
              local_1fe0 = local_1fe8;
              duckdb_je_arena_dalloc_small
                        ((tsdn_t *)in_stack_ffffffffffffc610,
                         (void *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608));
            }
          }
        }
      }
    }
    else {
      local_3890 = local_38a0;
      local_2ec0 = local_38a0;
      local_2ec8 = local_38a8;
      local_2ed0.tcache = local_38b0.tcache;
      local_2ed8 = (ulong *)local_38bc;
      local_2ed9 = 0;
      local_2eda = 0;
      local_2e88 = local_38a0;
      local_2e68 = local_38a0;
      if (local_38a0 == (tsd_t *)0x0) {
        local_2e80 = (witness_tsd_t *)0x0;
      }
      else {
        local_2e60 = local_38a0;
        local_2e90 = local_38a0;
        local_2e70 = local_38a0;
        local_1290 = local_38a0;
        local_2e71 = (local_38a0->state).repr;
        local_f8 = local_38a0;
        local_2e80 = &local_38a0->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
      }
      witness_assert_depth_to_rank((witness_tsdn_t *)local_2e80,WITNESS_RANK_CORE,0);
      if ((local_2ed9 & 1) != 0) {
        local_2e50 = local_2ec0;
        local_2e58 = local_2ec8;
        local_2e30 = local_2ec0;
        local_2e38 = local_2ec8;
        local_2c78 = local_2ec0;
        local_2c80 = &duckdb_je_arena_emap_global;
        local_2c88 = local_2ec8;
        local_1030 = local_2ec0;
        local_1038 = &local_2e08;
        local_1020 = local_2ec0;
        if (local_2ec0 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_1038);
          local_1028 = local_1038;
        }
        else {
          local_1018 = local_2ec0;
          local_f50 = local_2ec0;
          local_dd8 = local_2ec0;
          local_dd0 = local_2ec0;
          local_dd9 = (local_2ec0->state).repr;
          local_dc8 = local_2ec0;
          local_1028 = &local_2ec0->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_2e10 = local_1028;
        rtree_read(in_stack_ffffffffffffc638,
                   (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                   (rtree_ctx_t *)in_stack_ffffffffffffc628,
                   CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
        local_2e40 = local_2e28;
        local_2e44 = edata_arena_ind_get(local_2e28);
        in_stack_ffffffffffffc638 = (tsdn_t *)(duckdb_je_arenas + local_2e44);
        local_2c64 = 0;
        local_2c54 = 0;
        in_stack_ffffffffffffc640 = 0;
        uStack_2c50 = 0;
        in_stack_ffffffffffffc634 = 0;
        in_stack_ffffffffffffc628 = *(arena_t **)&in_stack_ffffffffffffc638->tsd;
        ptStack_2eb0 = local_2ec0;
        prStack_2eb8 = local_2ec8;
        ptStack_7c8 = local_2ec0;
        prStack_7d0 = local_2ec8;
        ptStack_600 = local_2ec0;
        peStack_608 = &duckdb_je_arena_emap_global;
        prStack_610 = local_2ec8;
        puStack_618 = auStack_7d8;
        ptStack_5d8 = local_2ec0;
        prStack_5e0 = &rStack_798;
        ptStack_5c8 = local_2ec0;
        paStack_2c70 = in_stack_ffffffffffffc628;
        local_2c60 = in_stack_ffffffffffffc638;
        if (local_2ec0 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(prStack_5e0);
          prStack_5d0 = prStack_5e0;
        }
        else {
          ptStack_5c0 = local_2ec0;
          ptStack_5b8 = local_2ec0;
          ptStack_5a8 = local_2ec0;
          ptStack_5a0 = local_2ec0;
          uStack_5a9 = (local_2ec0->state).repr;
          ptStack_598 = local_2ec0;
          prStack_5d0 = &local_2ec0->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        prStack_7a0 = prStack_5d0;
        rVar10 = rtree_metadata_read((tsdn_t *)
                                     CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                     rtree,rtree_ctx_18,in_stack_ffffffffffffc640);
        rStack_7c0._0_8_ = rVar10._0_8_;
        uStack_7ac._0_4_ = rStack_7c0.szind;
        uStack_7ac._4_4_ = rStack_7c0.state;
        uVar4 = uStack_7ac;
        rStack_7c0._8_4_ = rVar10._8_4_;
        uStack_7a4._0_1_ = rStack_7c0.is_head;
        uStack_7a4._1_1_ = rStack_7c0.slab;
        uStack_7a4._2_2_ = rStack_7c0._10_2_;
        uStack_7ac._0_4_ = rVar10.szind;
        rStack_7c0 = rVar10;
        *puStack_618 = (uint)uStack_7ac;
        uStack_7ac = uVar4;
        *(byte *)(puStack_618 + 1) = uStack_7a4._1_1_ & 1;
        uStack_5f4 = auStack_7d8[0];
        uStack_5e8 = auStack_7d8[0];
        uStack_5e4 = auStack_7d8[0];
        sStack_5f0 = duckdb_je_sz_index2size_tab[auStack_7d8[0]];
        arena_internal_sub(in_stack_ffffffffffffc628,sStack_5f0);
      }
      if (((local_2ed9 & 1) == 0) && (local_2ea0 = local_2ec0, local_2ec0 != (tsd_t *)0x0)) {
        local_2e98 = local_2ec0;
        local_2ea8 = local_2ec0;
        local_c0 = local_2ec0;
        local_b8 = local_2ec0;
        local_c1 = (local_2ec0->state).repr;
        local_10 = local_2ec0;
      }
      local_2798 = local_2ec0;
      local_27a0 = local_2ec8;
      local_27a8.tcache = local_2ed0.tcache;
      local_27b0 = local_2ed8;
      local_27b1 = local_2eda & 1;
      if (local_2ed0.tcache == (tcache_t *)0x0) {
        arena_dalloc_no_tcache
                  ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                   in_stack_ffffffffffffc600.repr);
      }
      else {
        if (local_2ed8 == (ulong *)0x0) {
          local_25d0 = local_2ec0;
          local_25d8 = &duckdb_je_arena_emap_global;
          local_25e0 = local_2ec8;
          local_25e8 = &local_27bc;
          local_10a8 = local_2ec0;
          local_10b0 = &local_2768;
          local_1098 = local_2ec0;
          if (local_2ec0 == (tsd_t *)0x0) {
            duckdb_je_rtree_ctx_data_init(local_10b0);
            local_10a0 = local_10b0;
          }
          else {
            local_1090 = local_2ec0;
            local_f38 = local_2ec0;
            local_e38 = local_2ec0;
            local_e30 = local_2ec0;
            local_e39 = (local_2ec0->state).repr;
            local_e28 = local_2ec0;
            local_10a0 = &local_2ec0->
                          cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
          }
          local_2770 = local_10a0;
          rVar10 = rtree_metadata_read((tsdn_t *)
                                       CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658)
                                       ,rtree,rtree_ctx_18,in_stack_ffffffffffffc640);
          local_2790._0_8_ = rVar10._0_8_;
          local_277c._0_4_ = local_2790.szind;
          local_277c._4_4_ = local_2790.state;
          uVar4 = local_277c;
          local_2790._8_4_ = rVar10._8_4_;
          local_2774._0_1_ = local_2790.is_head;
          local_2774._1_1_ = local_2790.slab;
          local_2774._2_2_ = local_2790._10_2_;
          local_277c._0_4_ = rVar10.szind;
          local_2790 = rVar10;
          *(szind_t *)local_25e8 = (szind_t)local_277c;
          local_277c = uVar4;
          *(byte *)((long)local_25e8 + 4) = local_2774._1_1_ & 1;
        }
        else {
          local_27bc = *local_2ed8;
        }
        if ((local_27bc & 0x100000000) == 0) {
          local_1b60 = local_2798;
          local_1b68 = local_27a0;
          local_1b70.tcache = local_27a8.tcache;
          local_1b74 = (uint)local_27bc;
          local_1b75 = local_27b1 & 1;
          local_1b76 = 0;
          uVar11 = (uint)local_27bc;
          uVar7 = tcache_nbins_get((local_27a8.tcache)->tcache_slow);
          if (uVar11 < uVar7) {
            local_1988 = (local_1b70.tcache)->bins + local_1b74;
            local_1990 = (local_1b70.tcache)->tcache_slow;
            local_197c = local_1b74;
            local_1991 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
            local_1998 = tcache_nbins_get(local_1990);
            local_199a = cache_bin_ncached_max_get_unsafe(local_1988);
            if ((local_1991 & 1) == 0) {
              local_1978 = local_1b60;
              local_1420 = local_1b60;
              local_1428.tcache = local_1b70.tcache;
              local_1430 = local_1b68;
              local_1434 = local_1b74;
              local_1435 = local_1b75 & 1;
              local_1440 = (local_1b70.tcache)->bins + local_1b74;
              local_1400 = local_1b68;
              bVar9 = ((uint)local_1440->stack_head & 0xffff) != (uint)local_1440->low_bits_full;
              local_13f8 = local_1440;
              local_13e9 = bVar9;
              local_13e8 = local_1440;
              if (bVar9) {
                local_13d8 = local_1b68;
                local_1440->stack_head = local_1440->stack_head + -1;
                *local_1440->stack_head = local_1b68;
                local_13d0 = local_1440;
                cache_bin_assert_earlier
                          (local_1440,local_1440->low_bits_full,(uint16_t)local_1440->stack_head);
              }
              else {
                cVar6 = cache_bin_ncached_max_get((cache_bin_t *)0x249eaa0);
                local_1444 = (int)(uint)cVar6 >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f);
                duckdb_je_tcache_bin_flush_large
                          (local_1420,local_1428.tcache,local_1440,local_1434,local_1444);
                local_1410 = local_1440;
                local_1418 = local_1430;
                local_13e0 = local_1440;
                local_1445 = ((uint)local_1440->stack_head & 0xffff) !=
                             (uint)local_1440->low_bits_full;
                local_1401 = local_1445;
                if ((bool)local_1445) {
                  local_13c0 = local_1440;
                  local_13c8 = local_1430;
                  local_1440->stack_head = local_1440->stack_head + -1;
                  *local_1440->stack_head = local_1430;
                  cache_bin_assert_earlier
                            (local_1440,local_1440->low_bits_full,(uint16_t)local_1440->stack_head);
                }
              }
              goto LAB_024a0202;
            }
          }
          local_19a8 = local_1b60;
          local_19b0 = &duckdb_je_arena_emap_global;
          local_19b8 = local_1b68;
          local_1170 = local_1b60;
          local_1178 = &local_1b38;
          local_1160 = local_1b60;
          if (local_1b60 == (tsd_t *)0x0) {
            duckdb_je_rtree_ctx_data_init(local_1178);
            local_1168 = local_1178;
          }
          else {
            local_1158 = local_1b60;
            local_f10 = local_1b60;
            local_ed8 = local_1b60;
            local_ed0 = local_1b60;
            local_ed9 = (local_1b60->state).repr;
            local_ec8 = local_1b60;
            local_1168 = &local_1b60->
                          cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
          }
          local_1b40 = local_1168;
          rtree_read(in_stack_ffffffffffffc638,
                     (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                     (rtree_ctx_t *)in_stack_ffffffffffffc628,
                     CONCAT44(uVar11,in_stack_ffffffffffffc620));
          local_1b80 = local_1b58;
          local_1738 = local_1b58;
          local_1740 = local_1b68;
          local_1744 = local_1b74;
          duckdb_je_large_dalloc
                    ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                     (edata_t *)in_stack_ffffffffffffc600.repr);
        }
        else {
          local_2198 = local_2798;
          local_21a0 = local_27a0;
          local_25c8 = local_2798;
          local_2060 = local_2798;
          local_2068.tcache = local_27a8.tcache;
          local_2070 = local_27a0;
          local_2074 = (uint)local_27bc;
          local_2075 = local_27b1 & 1;
          local_2080 = (local_27a8.tcache)->bins + (local_27bc & 0xffffffff);
          local_16f8 = local_27a0;
          local_1630 = local_27a0;
          bVar9 = ((uint)local_2080->stack_head & 0xffff) != (uint)local_2080->low_bits_full;
          local_1628 = local_2080;
          local_1619 = bVar9;
          local_1598 = local_2080;
          if (bVar9) {
            local_1518 = local_27a0;
            local_2080->stack_head = local_2080->stack_head + -1;
            *local_2080->stack_head = local_27a0;
            local_1510 = local_2080;
            cache_bin_assert_earlier
                      (local_2080,local_2080->low_bits_full,(uint16_t)local_2080->stack_head);
          }
          else {
            local_2040 = (local_27a8.tcache)->tcache_slow;
            local_202c = (uint)local_27bc;
            local_2038 = local_2080;
            local_2041 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
            local_2048 = tcache_nbins_get(local_2040);
            local_204a = cache_bin_ncached_max_get_unsafe(local_2038);
            if ((local_2041 & 1) == 0) {
              local_2082 = cache_bin_ncached_max_get((cache_bin_t *)0x249e65a);
              local_2088 = (int)(uint)local_2082 >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f);
              duckdb_je_tcache_bin_flush_small
                        (local_2060,local_2068.tcache,local_2080,local_2074,local_2088);
              local_1640 = local_2080;
              local_1648 = local_2070;
              local_1590 = local_2080;
              local_2089 = ((uint)local_2080->stack_head & 0xffff) !=
                           (uint)local_2080->low_bits_full;
              local_1631 = local_2089;
              if ((bool)local_2089) {
                local_1500 = local_2080;
                local_1508 = local_2070;
                local_2080->stack_head = local_2080->stack_head + -1;
                *local_2080->stack_head = local_2070;
                cache_bin_assert_earlier
                          (local_2080,local_2080->low_bits_full,(uint16_t)local_2080->stack_head);
              }
            }
            else {
              local_2058 = local_2060;
              duckdb_je_arena_dalloc_small
                        ((tsdn_t *)in_stack_ffffffffffffc610,
                         (void *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608));
            }
          }
        }
      }
    }
LAB_024a0202:
    local_3460 = local_38a0;
    local_d00 = local_38a0;
    local_d09 = 0;
    local_c98 = local_38a0;
    local_c28 = local_38a0;
    local_c30 = local_d38;
    local_c31 = 0;
    local_d38[0] = 0;
    local_bf8 = local_38a0;
    local_bf0 = local_38a0;
    local_bf9 = (local_38a0->state).repr;
    local_be8 = local_38a0;
    local_af8 = local_38a0;
    local_af0 = local_38a0;
    local_af9 = (local_38a0->state).repr;
    local_a38 = local_38a0;
    local_d28 = &local_38a0->
                 cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event
    ;
    local_ac8 = local_38a0;
    local_ac0 = local_38a0;
    local_ac9 = (local_38a0->state).repr;
    local_a28 = local_38a0;
    local_a98 = local_38a0;
    local_a90 = local_38a0;
    local_a99 = (local_38a0->state).repr;
    local_a88 = local_38a0;
    local_d18 = &local_38a0->
                 cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
    ;
    local_bd8 = local_d38;
    local_d40 = local_38a0->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated
    ;
    local_bc0 = local_d40 + uVar2;
    local_bb8 = local_d38;
    local_38a0->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = local_bc0
    ;
    local_ba8 = local_d38;
    if (uVar2 < local_38a0->
                cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
                - local_d40) {
      return;
    }
    local_3468 = uVar2;
    local_d08 = uVar2;
    duckdb_je_te_event_trigger(in_stack_ffffffffffffc6b8,ctx_00);
    return;
  }
  local_3440 = ptVar5;
  local_3848 = ptVar5;
  local_3858.tcache = local_38e0.tcache;
  local_3859 = 0;
  local_3458 = ptVar5;
  local_3828 = ptVar5;
  local_3820 = ptVar5;
  local_3438 = ptVar5;
  local_48 = ptVar5;
  local_40 = ptVar5;
  local_49 = (ptVar5->state).repr;
  local_38 = ptVar5;
  local_3830 = ptVar5;
  local_3650 = ptVar5;
  local_3658 = &duckdb_je_arena_emap_global;
  local_3668 = (ulong *)local_3864;
  local_f90 = ptVar5;
  local_f98 = &local_37e8;
  local_f80 = ptVar5;
  local_3850 = in_RDI;
  if (ptVar5 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(local_f98);
    local_f88 = local_f98;
  }
  else {
    local_f78 = ptVar5;
    local_f70 = ptVar5;
    local_d58 = ptVar5;
    local_d50 = ptVar5;
    local_d59 = (ptVar5->state).repr;
    local_d48 = ptVar5;
    local_f88 = &ptVar5->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  local_37f0 = local_f88;
  rVar10 = rtree_metadata_read((tsdn_t *)
                               CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                               in_stack_ffffffffffffc650,in_stack_ffffffffffffc648,
                               in_stack_ffffffffffffc640);
  local_3810._0_8_ = rVar10._0_8_;
  local_37fc._0_4_ = local_3810.szind;
  local_37fc._4_4_ = local_3810.state;
  uVar3 = local_37fc;
  local_3810._8_4_ = rVar10._8_4_;
  local_37f4._0_1_ = local_3810.is_head;
  local_37f4._1_1_ = local_3810.slab;
  local_37f4._2_2_ = local_3810._10_2_;
  local_37fc._0_4_ = rVar10.szind;
  local_3810 = rVar10;
  *(szind_t *)local_3668 = (szind_t)local_37fc;
  local_37fc = uVar3;
  *(byte *)((long)local_3668 + 4) = local_37f4._1_1_ & 1;
  local_3480 = local_3864[0];
  local_3408 = local_3864[0];
  local_3404 = local_3864[0];
  local_3870 = duckdb_je_sz_index2size_tab[local_3864[0]];
  local_3410 = local_3870;
  if (((local_3859 ^ 0xff) & 1) == 0) {
    if (((local_3859 & 1) != 0) && ((duckdb_je_opt_junk_free & 1U) != 0)) {
      default_junk_free(in_stack_ffffffffffffc600.repr,
                        CONCAT44(in_stack_ffffffffffffc5fc,in_stack_ffffffffffffc5f8));
    }
    local_3840 = local_3848;
    local_3150 = local_3848;
    local_3158 = local_3850;
    local_3160.tcache = local_3858.tcache;
    local_3168 = (ulong *)local_3864;
    local_3169 = 0;
    local_316a = 1;
    local_3118 = local_3848;
    local_30f8 = local_3848;
    if (local_3848 == (tsd_t *)0x0) {
      local_3110 = (witness_tsd_t *)0x0;
    }
    else {
      local_30f0 = local_3848;
      local_3120 = local_3848;
      local_3100 = local_3848;
      local_1288 = local_3848;
      local_3101 = (local_3848->state).repr;
      local_f0 = local_3848;
      local_3110 = &local_3848->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
    }
    witness_assert_depth_to_rank((witness_tsdn_t *)local_3110,WITNESS_RANK_CORE,0);
    if ((local_3169 & 1) != 0) {
      local_30e0 = local_3150;
      local_30e8 = local_3158;
      local_30c0 = local_3150;
      local_30c8 = local_3158;
      local_2f08 = local_3150;
      local_2f10 = &duckdb_je_arena_emap_global;
      local_2f18 = local_3158;
      local_1008 = local_3150;
      local_1010 = &local_3098;
      local_ff8 = local_3150;
      if (local_3150 == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(local_1010);
        local_1000 = local_1010;
      }
      else {
        local_ff0 = local_3150;
        local_f58 = local_3150;
        local_db8 = local_3150;
        local_db0 = local_3150;
        local_db9 = (local_3150->state).repr;
        local_da8 = local_3150;
        local_1000 = &local_3150->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      local_30a0 = local_1000;
      rtree_read(in_stack_ffffffffffffc638,
                 (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                 (rtree_ctx_t *)in_stack_ffffffffffffc628,
                 CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
      local_30d0 = local_30b8;
      local_30d4 = edata_arena_ind_get(local_30b8);
      local_2ef0 = duckdb_je_arenas + local_30d4;
      local_2ef4 = 0;
      local_2ee4 = 0;
      uStack_2ee0 = 0;
      paVar1 = (arena_t *)local_2ef0->repr;
      ptStack_3140 = local_3150;
      prStack_3148 = local_3158;
      ptStack_580 = local_3150;
      prStack_588 = local_3158;
      ptStack_3b8 = local_3150;
      peStack_3c0 = &duckdb_je_arena_emap_global;
      prStack_3c8 = local_3158;
      puStack_3d0 = auStack_590;
      ptStack_390 = local_3150;
      prStack_398 = &rStack_550;
      ptStack_380 = local_3150;
      paStack_2f00 = paVar1;
      if (local_3150 == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(prStack_398);
        prStack_388 = prStack_398;
      }
      else {
        ptStack_378 = local_3150;
        ptStack_370 = local_3150;
        ptStack_360 = local_3150;
        ptStack_358 = local_3150;
        uStack_361 = (local_3150->state).repr;
        ptStack_350 = local_3150;
        prStack_388 = &local_3150->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      prStack_558 = prStack_388;
      rVar10 = rtree_metadata_read((tsdn_t *)
                                   CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                   in_stack_ffffffffffffc650,in_stack_ffffffffffffc648,
                                   in_stack_ffffffffffffc640);
      rStack_578._0_8_ = rVar10._0_8_;
      uStack_564._0_4_ = rStack_578.szind;
      uStack_564._4_4_ = rStack_578.state;
      uVar4 = uStack_564;
      rStack_578._8_4_ = rVar10._8_4_;
      uStack_55c._0_1_ = rStack_578.is_head;
      uStack_55c._1_1_ = rStack_578.slab;
      uStack_55c._2_2_ = rStack_578._10_2_;
      uStack_564._0_4_ = rVar10.szind;
      rStack_578 = rVar10;
      *puStack_3d0 = (uint)uStack_564;
      uStack_564 = uVar4;
      *(byte *)(puStack_3d0 + 1) = uStack_55c._1_1_ & 1;
      uStack_3ac = auStack_590[0];
      uStack_3a0 = auStack_590[0];
      uStack_39c = auStack_590[0];
      sStack_3a8 = duckdb_je_sz_index2size_tab[auStack_590[0]];
      arena_internal_sub(paVar1,sStack_3a8);
    }
    if (((local_3169 & 1) == 0) && (local_3130 = local_3150, local_3150 != (tsd_t *)0x0)) {
      local_3128 = local_3150;
      local_3138 = local_3150;
      local_a8 = local_3150;
      local_a0 = local_3150;
      local_a9 = (local_3150->state).repr;
      local_18 = local_3150;
    }
    local_2598 = local_3150;
    local_25a0 = local_3158;
    local_25a8.tcache = local_3160.tcache;
    local_25b0 = local_3168;
    local_25b1 = local_316a & 1;
    if (local_3160.tcache == (tcache_t *)0x0) {
      arena_dalloc_no_tcache
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                 in_stack_ffffffffffffc600.repr);
    }
    else {
      if (local_3168 == (ulong *)0x0) {
        local_23d0 = local_3150;
        local_23d8 = &duckdb_je_arena_emap_global;
        local_23e0 = local_3158;
        local_23e8 = &local_25bc;
        local_10d0 = local_3150;
        local_10d8 = &local_2568;
        local_10c0 = local_3150;
        if (local_3150 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_10d8);
          local_10c8 = local_10d8;
        }
        else {
          local_10b8 = local_3150;
          local_f30 = local_3150;
          local_e58 = local_3150;
          local_e50 = local_3150;
          local_e59 = (local_3150->state).repr;
          local_e48 = local_3150;
          local_10c8 = &local_3150->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_2570 = local_10c8;
        rVar10 = rtree_metadata_read((tsdn_t *)
                                     CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                     in_stack_ffffffffffffc650,in_stack_ffffffffffffc648,
                                     in_stack_ffffffffffffc640);
        local_2590._0_8_ = rVar10._0_8_;
        local_257c._0_4_ = local_2590.szind;
        local_257c._4_4_ = local_2590.state;
        uVar4 = local_257c;
        local_2590._8_4_ = rVar10._8_4_;
        local_2574._0_1_ = local_2590.is_head;
        local_2574._1_1_ = local_2590.slab;
        local_2574._2_2_ = local_2590._10_2_;
        local_257c._0_4_ = rVar10.szind;
        local_2590 = rVar10;
        *(szind_t *)local_23e8 = (szind_t)local_257c;
        local_257c = uVar4;
        *(byte *)((long)local_23e8 + 4) = local_2574._1_1_ & 1;
      }
      else {
        local_25bc = *local_3168;
      }
      if ((local_25bc & 0x100000000) == 0) {
        local_1d70 = local_2598;
        local_1d78 = local_25a0;
        local_1d80.tcache = local_25a8.tcache;
        local_1d84 = (uint)local_25bc;
        local_1d85 = local_25b1 & 1;
        local_1d86 = 0;
        uVar11 = (uint)local_25bc;
        uVar7 = tcache_nbins_get((local_25a8.tcache)->tcache_slow);
        if (uVar11 < uVar7) {
          local_1b98 = (local_1d80.tcache)->bins + local_1d84;
          local_1ba0 = (local_1d80.tcache)->tcache_slow;
          local_1b8c = local_1d84;
          local_1ba1 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
          local_1ba8 = tcache_nbins_get(local_1ba0);
          local_1baa = cache_bin_ncached_max_get_unsafe(local_1b98);
          if ((local_1ba1 & 1) == 0) {
            local_1b88 = local_1d70;
            local_1390 = local_1d70;
            local_1398.tcache = local_1d80.tcache;
            local_13a0 = local_1d78;
            local_13a4 = local_1d84;
            local_13a5 = local_1d85 & 1;
            local_13b0 = (local_1d80.tcache)->bins + local_1d84;
            local_1370 = local_1d78;
            bVar9 = ((uint)local_13b0->stack_head & 0xffff) != (uint)local_13b0->low_bits_full;
            local_1368 = local_13b0;
            local_1359 = bVar9;
            local_1358 = local_13b0;
            if (bVar9) {
              local_1348 = local_1d78;
              local_13b0->stack_head = local_13b0->stack_head + -1;
              *local_13b0->stack_head = local_1d78;
              local_1340 = local_13b0;
              cache_bin_assert_earlier
                        (local_13b0,local_13b0->low_bits_full,(uint16_t)local_13b0->stack_head);
            }
            else {
              cVar6 = cache_bin_ncached_max_get((cache_bin_t *)0x249ce66);
              local_13b4 = (int)(uint)cVar6 >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f);
              duckdb_je_tcache_bin_flush_large
                        (local_1390,local_1398.tcache,local_13b0,local_13a4,local_13b4);
              local_1380 = local_13b0;
              local_1388 = local_13a0;
              local_1350 = local_13b0;
              local_13b5 = ((uint)local_13b0->stack_head & 0xffff) !=
                           (uint)local_13b0->low_bits_full;
              local_1371 = local_13b5;
              if ((bool)local_13b5) {
                local_1330 = local_13b0;
                local_1338 = local_13a0;
                local_13b0->stack_head = local_13b0->stack_head + -1;
                *local_13b0->stack_head = local_13a0;
                cache_bin_assert_earlier
                          (local_13b0,local_13b0->low_bits_full,(uint16_t)local_13b0->stack_head);
              }
            }
            goto LAB_0249d140;
          }
        }
        local_1bb8 = local_1d70;
        local_1bc0 = &duckdb_je_arena_emap_global;
        local_1bc8 = local_1d78;
        local_1148 = local_1d70;
        local_1150 = &local_1d48;
        local_1138 = local_1d70;
        if (local_1d70 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_1150);
          local_1140 = local_1150;
        }
        else {
          local_1130 = local_1d70;
          local_f18 = local_1d70;
          local_eb8 = local_1d70;
          local_eb0 = local_1d70;
          local_eb9 = (local_1d70->state).repr;
          local_ea8 = local_1d70;
          local_1140 = &local_1d70->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_1d50 = local_1140;
        rtree_read(in_stack_ffffffffffffc638,
                   (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                   (rtree_ctx_t *)in_stack_ffffffffffffc628,
                   CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
        local_1d90 = local_1d68;
        local_1720 = local_1d68;
        local_1728 = local_1d78;
        local_172c = local_1d84;
        duckdb_je_large_dalloc
                  ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                   (edata_t *)in_stack_ffffffffffffc600.repr);
      }
      else {
        local_21a8 = local_2598;
        local_21b0 = local_25a0;
        local_23c8 = local_2598;
        local_20d8 = local_2598;
        local_20e0.tcache = local_25a8.tcache;
        local_20e8 = local_25a0;
        local_20ec = (uint)local_25bc;
        local_20ed = local_25b1 & 1;
        local_20f8 = (local_25a8.tcache)->bins + (local_25bc & 0xffffffff);
        local_16f0 = local_25a0;
        local_1600 = local_25a0;
        bVar9 = ((uint)local_20f8->stack_head & 0xffff) != (uint)local_20f8->low_bits_full;
        local_15f8 = local_20f8;
        local_15e9 = bVar9;
        local_15a8 = local_20f8;
        if (bVar9) {
          local_1538 = local_25a0;
          local_20f8->stack_head = local_20f8->stack_head + -1;
          *local_20f8->stack_head = local_25a0;
          local_1530 = local_20f8;
          cache_bin_assert_earlier
                    (local_20f8,local_20f8->low_bits_full,(uint16_t)local_20f8->stack_head);
        }
        else {
          local_20b8 = (local_25a8.tcache)->tcache_slow;
          local_20a4 = (uint)local_25bc;
          local_20b0 = local_20f8;
          local_20b9 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
          local_20c0 = tcache_nbins_get(local_20b8);
          local_20c2 = cache_bin_ncached_max_get_unsafe(local_20b0);
          if ((local_20b9 & 1) == 0) {
            local_20fa = cache_bin_ncached_max_get((cache_bin_t *)0x249ca20);
            local_2100 = (int)(uint)local_20fa >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f);
            duckdb_je_tcache_bin_flush_small
                      (local_20d8,local_20e0.tcache,local_20f8,local_20ec,local_2100);
            local_1610 = local_20f8;
            local_1618 = local_20e8;
            local_15a0 = local_20f8;
            local_2101 = ((uint)local_20f8->stack_head & 0xffff) != (uint)local_20f8->low_bits_full;
            local_1601 = local_2101;
            if ((bool)local_2101) {
              local_1520 = local_20f8;
              local_1528 = local_20e8;
              local_20f8->stack_head = local_20f8->stack_head + -1;
              *local_20f8->stack_head = local_20e8;
              cache_bin_assert_earlier
                        (local_20f8,local_20f8->low_bits_full,(uint16_t)local_20f8->stack_head);
            }
          }
          else {
            local_20d0 = local_20d8;
            duckdb_je_arena_dalloc_small
                      ((tsdn_t *)in_stack_ffffffffffffc610,
                       (void *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608));
          }
        }
      }
    }
  }
  else {
    local_3838 = local_3848;
    local_33e0 = local_3848;
    local_33e8 = local_3850;
    local_33f0.tcache = local_3858.tcache;
    local_33f8 = (ulong *)local_3864;
    local_33f9 = 0;
    local_33fa = 0;
    local_33a8 = local_3848;
    local_3388 = local_3848;
    if (local_3848 == (tsd_t *)0x0) {
      local_33a0 = (witness_tsd_t *)0x0;
    }
    else {
      local_3380 = local_3848;
      local_33b0 = local_3848;
      local_3390 = local_3848;
      local_1280 = local_3848;
      local_3391 = (local_3848->state).repr;
      local_e8 = local_3848;
      local_33a0 = &local_3848->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
    }
    witness_assert_depth_to_rank((witness_tsdn_t *)local_33a0,WITNESS_RANK_CORE,0);
    if ((local_33f9 & 1) != 0) {
      local_3370 = local_33e0;
      local_3378 = local_33e8;
      local_3350 = local_33e0;
      local_3358 = local_33e8;
      local_3198 = local_33e0;
      local_31a0 = &duckdb_je_arena_emap_global;
      local_31a8 = local_33e8;
      local_fe0 = local_33e0;
      local_fe8 = &local_3328;
      local_fd0 = local_33e0;
      if (local_33e0 == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(local_fe8);
        local_fd8 = local_fe8;
      }
      else {
        local_fc8 = local_33e0;
        local_f60 = local_33e0;
        local_d98 = local_33e0;
        local_d90 = local_33e0;
        local_d99 = (local_33e0->state).repr;
        local_d88 = local_33e0;
        local_fd8 = &local_33e0->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      local_3330 = local_fd8;
      rtree_read(in_stack_ffffffffffffc638,
                 (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                 (rtree_ctx_t *)in_stack_ffffffffffffc628,
                 CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
      local_3360 = local_3348;
      local_3364 = edata_arena_ind_get(local_3348);
      local_3180 = duckdb_je_arenas + local_3364;
      local_3184 = 0;
      local_3174 = 0;
      uStack_3170 = 0;
      paVar1 = (arena_t *)local_3180->repr;
      ptStack_33d0 = local_33e0;
      prStack_33d8 = local_33e8;
      ptStack_338 = local_33e0;
      prStack_340 = local_33e8;
      ptStack_170 = local_33e0;
      peStack_178 = &duckdb_je_arena_emap_global;
      prStack_180 = local_33e8;
      puStack_188 = auStack_348;
      ptStack_148 = local_33e0;
      prStack_150 = &rStack_308;
      ptStack_138 = local_33e0;
      paStack_3190 = paVar1;
      if (local_33e0 == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(prStack_150);
        prStack_140 = prStack_150;
      }
      else {
        ptStack_130 = local_33e0;
        ptStack_128 = local_33e0;
        ptStack_118 = local_33e0;
        ptStack_110 = local_33e0;
        uStack_119 = (local_33e0->state).repr;
        ptStack_108 = local_33e0;
        prStack_140 = &local_33e0->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      prStack_310 = prStack_140;
      rVar10 = rtree_metadata_read((tsdn_t *)
                                   CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                   in_stack_ffffffffffffc650,in_stack_ffffffffffffc648,
                                   in_stack_ffffffffffffc640);
      rStack_330._0_8_ = rVar10._0_8_;
      uStack_31c._0_4_ = rStack_330.szind;
      uStack_31c._4_4_ = rStack_330.state;
      uVar4 = uStack_31c;
      rStack_330._8_4_ = rVar10._8_4_;
      uStack_314._0_1_ = rStack_330.is_head;
      uStack_314._1_1_ = rStack_330.slab;
      uStack_314._2_2_ = rStack_330._10_2_;
      uStack_31c._0_4_ = rVar10.szind;
      rStack_330 = rVar10;
      *puStack_188 = (uint)uStack_31c;
      uStack_31c = uVar4;
      *(byte *)(puStack_188 + 1) = uStack_314._1_1_ & 1;
      uStack_164 = auStack_348[0];
      uStack_158 = auStack_348[0];
      uStack_154 = auStack_348[0];
      sStack_160 = duckdb_je_sz_index2size_tab[auStack_348[0]];
      arena_internal_sub(paVar1,sStack_160);
    }
    if (((local_33f9 & 1) == 0) && (local_33c0 = local_33e0, local_33e0 != (tsd_t *)0x0)) {
      local_33b8 = local_33e0;
      local_33c8 = local_33e0;
      local_90 = local_33e0;
      local_88 = local_33e0;
      local_91 = (local_33e0->state).repr;
      local_20 = local_33e0;
    }
    local_2398 = local_33e0;
    local_23a0 = local_33e8;
    local_23a8.tcache = local_33f0.tcache;
    local_23b0 = local_33f8;
    local_23b1 = local_33fa & 1;
    if (local_33f0.tcache == (tcache_t *)0x0) {
      arena_dalloc_no_tcache
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                 in_stack_ffffffffffffc600.repr);
    }
    else {
      if (local_33f8 == (ulong *)0x0) {
        local_21d0 = local_33e0;
        local_21d8 = &duckdb_je_arena_emap_global;
        local_21e0 = local_33e8;
        local_21e8 = &local_23bc;
        local_10f8 = local_33e0;
        local_1100 = &local_2368;
        local_10e8 = local_33e0;
        if (local_33e0 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_1100);
          local_10f0 = local_1100;
        }
        else {
          local_10e0 = local_33e0;
          local_f28 = local_33e0;
          local_e78 = local_33e0;
          local_e70 = local_33e0;
          local_e79 = (local_33e0->state).repr;
          local_e68 = local_33e0;
          local_10f0 = &local_33e0->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_2370 = local_10f0;
        rVar10 = rtree_metadata_read((tsdn_t *)
                                     CONCAT44(in_stack_ffffffffffffc65c,in_stack_ffffffffffffc658),
                                     in_stack_ffffffffffffc650,in_stack_ffffffffffffc648,
                                     in_stack_ffffffffffffc640);
        local_2390._0_8_ = rVar10._0_8_;
        local_237c._0_4_ = local_2390.szind;
        local_237c._4_4_ = local_2390.state;
        uVar4 = local_237c;
        local_2390._8_4_ = rVar10._8_4_;
        local_2374._0_1_ = local_2390.is_head;
        local_2374._1_1_ = local_2390.slab;
        local_2374._2_2_ = local_2390._10_2_;
        local_237c._0_4_ = rVar10.szind;
        local_2390 = rVar10;
        *(szind_t *)local_21e8 = (szind_t)local_237c;
        local_237c = uVar4;
        *(byte *)((long)local_21e8 + 4) = local_2374._1_1_ & 1;
      }
      else {
        local_23bc = *local_33f8;
      }
      uVar11 = (uint)local_23bc;
      if ((local_23bc & 0x100000000) == 0) {
        local_1f80 = local_2398;
        local_1f88 = local_23a0;
        local_1f90.tcache = local_23a8.tcache;
        local_1f94 = (uint)local_23bc;
        local_1f95 = local_23b1 & 1;
        local_1f96 = 0;
        uVar7 = tcache_nbins_get((local_23a8.tcache)->tcache_slow);
        if (uVar11 < uVar7) {
          local_1da8 = (local_1f90.tcache)->bins + local_1f94;
          local_1db0 = (local_1f90.tcache)->tcache_slow;
          local_1d9c = local_1f94;
          local_1db1 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
          local_1db8 = tcache_nbins_get(local_1db0);
          local_1dba = cache_bin_ncached_max_get_unsafe(local_1da8);
          if ((local_1db1 & 1) == 0) {
            local_1d98 = local_1f80;
            local_1300 = local_1f80;
            local_1308.tcache = local_1f90.tcache;
            local_1310 = local_1f88;
            local_1314 = local_1f94;
            local_1315 = local_1f95 & 1;
            local_1320 = (local_1f90.tcache)->bins + local_1f94;
            local_12e0 = local_1f88;
            bVar9 = ((uint)local_1320->stack_head & 0xffff) != (uint)local_1320->low_bits_full;
            local_12d8 = local_1320;
            local_12c9 = bVar9;
            local_12c8 = local_1320;
            if (bVar9) {
              local_12b8 = local_1f88;
              local_1320->stack_head = local_1320->stack_head + -1;
              *local_1320->stack_head = local_1f88;
              local_12b0 = local_1320;
              cache_bin_assert_earlier
                        (local_1320,local_1320->low_bits_full,(uint16_t)local_1320->stack_head);
            }
            else {
              cVar6 = cache_bin_ncached_max_get((cache_bin_t *)0x249b9d8);
              local_1324 = (int)(uint)cVar6 >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f);
              duckdb_je_tcache_bin_flush_large
                        (local_1300,local_1308.tcache,local_1320,local_1314,local_1324);
              local_12f0 = local_1320;
              local_12f8 = local_1310;
              local_12c0 = local_1320;
              local_1325 = ((uint)local_1320->stack_head & 0xffff) !=
                           (uint)local_1320->low_bits_full;
              local_12e1 = local_1325;
              if ((bool)local_1325) {
                local_12a0 = local_1320;
                local_12a8 = local_1310;
                local_1320->stack_head = local_1320->stack_head + -1;
                *local_1320->stack_head = local_1310;
                cache_bin_assert_earlier
                          (local_1320,local_1320->low_bits_full,(uint16_t)local_1320->stack_head);
              }
            }
            goto LAB_0249d140;
          }
        }
        local_1dc8 = local_1f80;
        local_1dd0 = &duckdb_je_arena_emap_global;
        local_1dd8 = local_1f88;
        local_1120 = local_1f80;
        local_1128 = &local_1f58;
        local_1110 = local_1f80;
        if (local_1f80 == (tsd_t *)0x0) {
          duckdb_je_rtree_ctx_data_init(local_1128);
          local_1118 = local_1128;
        }
        else {
          local_1108 = local_1f80;
          local_f20 = local_1f80;
          local_e98 = local_1f80;
          local_e90 = local_1f80;
          local_e99 = (local_1f80->state).repr;
          local_e88 = local_1f80;
          local_1118 = &local_1f80->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        local_1f60 = local_1118;
        rtree_read(in_stack_ffffffffffffc638,
                   (rtree_t *)CONCAT44(in_stack_ffffffffffffc634,in_stack_ffffffffffffc630),
                   (rtree_ctx_t *)in_stack_ffffffffffffc628,
                   CONCAT44(in_stack_ffffffffffffc624,in_stack_ffffffffffffc620));
        local_1fa0 = local_1f78;
        local_1708 = local_1f78;
        local_1710 = local_1f88;
        local_1714 = local_1f94;
        duckdb_je_large_dalloc
                  ((tsdn_t *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608),
                   (edata_t *)in_stack_ffffffffffffc600.repr);
      }
      else {
        local_21b8 = local_2398;
        local_21c0 = local_23a0;
        local_21c8 = local_2398;
        local_2150 = local_2398;
        local_2158.tcache = local_23a8.tcache;
        local_2160 = local_23a0;
        local_2164 = (uint)local_23bc;
        local_2165 = local_23b1 & 1;
        local_2170 = (local_23a8.tcache)->bins + (local_23bc & 0xffffffff);
        local_16e8 = local_23a0;
        local_15d0 = local_23a0;
        bVar9 = ((uint)local_2170->stack_head & 0xffff) != (uint)local_2170->low_bits_full;
        local_15c8 = local_2170;
        local_15b9 = bVar9;
        local_15b8 = local_2170;
        if (bVar9) {
          local_1558 = local_23a0;
          local_2170->stack_head = local_2170->stack_head + -1;
          *local_2170->stack_head = local_23a0;
          local_1550 = local_2170;
          cache_bin_assert_earlier
                    (local_2170,local_2170->low_bits_full,(uint16_t)local_2170->stack_head);
        }
        else {
          local_2130 = (local_23a8.tcache)->tcache_slow;
          local_211c = (uint)local_23bc;
          local_2128 = local_2170;
          local_2131 = cache_bin_disabled((cache_bin_t *)in_stack_ffffffffffffc600.repr);
          local_2138 = tcache_nbins_get(local_2130);
          local_213a = cache_bin_ncached_max_get_unsafe(local_2128);
          if ((local_2131 & 1) == 0) {
            local_2172 = cache_bin_ncached_max_get((cache_bin_t *)0x249b58c);
            local_2178 = (int)(uint)local_2172 >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f);
            duckdb_je_tcache_bin_flush_small
                      (local_2150,local_2158.tcache,local_2170,local_2164,local_2178);
            local_15e0 = local_2170;
            local_15e8 = local_2160;
            local_15b0 = local_2170;
            local_2179 = ((uint)local_2170->stack_head & 0xffff) != (uint)local_2170->low_bits_full;
            local_15d1 = local_2179;
            if ((bool)local_2179) {
              local_1540 = local_2170;
              local_1548 = local_2160;
              local_2170->stack_head = local_2170->stack_head + -1;
              *local_2170->stack_head = local_2160;
              cache_bin_assert_earlier
                        (local_2170,local_2170->low_bits_full,(uint16_t)local_2170->stack_head);
            }
          }
          else {
            local_2148 = local_2150;
            duckdb_je_arena_dalloc_small
                      ((tsdn_t *)in_stack_ffffffffffffc610,
                       (void *)CONCAT44(in_stack_ffffffffffffc60c,in_stack_ffffffffffffc608));
          }
        }
      }
    }
  }
LAB_0249d140:
  local_3470 = local_3848;
  local_3478 = local_3870;
  local_cb8 = local_3848;
  local_cc0 = local_3870;
  local_cc1 = 0;
  local_ca8 = local_3848;
  local_c80 = local_3848;
  local_c88 = local_cf0;
  local_c89 = 0;
  local_cf0[0] = 0;
  local_c50 = local_3848;
  local_c48 = local_3848;
  local_c51 = (local_3848->state).repr;
  local_c40 = local_3848;
  local_ae0 = local_3848;
  local_ad8 = local_3848;
  local_ae1 = (local_3848->state).repr;
  local_a40 = local_3848;
  local_ce0 = &local_3848->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_ab0 = local_3848;
  local_aa8 = local_3848;
  local_ab1 = (local_3848->state).repr;
  local_a30 = local_3848;
  local_a78 = local_3848;
  local_a70 = local_3848;
  local_a79 = (local_3848->state).repr;
  local_a68 = local_3848;
  local_cd0 = &local_3848->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
  ;
  local_be0 = local_cf0;
  local_cf8 = local_3848->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_bd0 = local_cf8 + local_3870;
  local_bc8 = local_cf0;
  local_3848->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = local_bd0;
  local_bb0 = local_cf0;
  if (local_3848->
      cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      local_cf8 <= local_3870) {
    duckdb_je_te_event_trigger(in_stack_ffffffffffffc6b8,in_stack_ffffffffffffc6b0);
  }
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_dallocx(void *ptr, int flags) {
	LOG("core.dallocx.entry", "ptr: %p, flags: %d", ptr, flags);

	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		ifree(tsd, ptr, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, flags};
		hook_invoke_dalloc(hook_dalloc_dallocx, ptr, args_raw);
		ifree(tsd, ptr, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.dallocx.exit", "");
}